

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_c_builder.c
# Opt level: O1

int gen_builder_struct_field_assign
              (fb_output_t *out,fb_compound_type_t *ct,int index,int arg_count,int conversion,
              int from_ptr)

{
  byte bVar1;
  ushort uVar2;
  short sVar3;
  uint16_t uVar4;
  undefined8 *puVar5;
  fb_symbol_t *pfVar6;
  fb_compound_type_t *ct_00;
  long lVar7;
  fb_schema_t *pfVar8;
  undefined1 auVar9 [16];
  enum_entry_t *peVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  FILE *pFVar14;
  size_t sVar15;
  undefined8 extraout_RAX;
  undefined *puVar16;
  ulong extraout_RAX_00;
  ulong uVar17;
  entry_t *peVar18;
  entry_t *peVar19;
  entry_t *peVar20;
  dict_entry_t *__base;
  size_t sVar21;
  uint uVar22;
  char *pcVar23;
  FILE *pFVar24;
  uint *puVar25;
  double dVar26;
  fb_output_t *pfVar27;
  char *__s;
  undefined8 extraout_RDX;
  undefined8 uVar28;
  undefined8 *puVar29;
  long lVar30;
  fb_symbol_t *pfVar31;
  size_t sVar32;
  char *pcVar33;
  char *__format;
  undefined8 *puVar34;
  char *pcVar35;
  fb_scoped_name_t *__stream;
  undefined4 in_register_00000084;
  FILE *pFVar36;
  FILE *pFVar37;
  FILE *pFVar38;
  fb_scoped_name_t *sn;
  undefined8 *puVar39;
  long lVar40;
  FILE *pFVar41;
  fb_scoped_name_t *pfVar42;
  bool bVar43;
  undefined4 uVar44;
  uint uStack_998;
  int iStack_994;
  fb_root_schema_t *pfStack_990;
  size_t sStack_988;
  undefined1 auStack_980 [8];
  gen_match_f *pgStack_978;
  gen_unmatched_f *pgStack_970;
  fb_compound_type_t *pfStack_968;
  undefined8 uStack_960;
  undefined8 uStack_958;
  undefined1 auStack_890 [24];
  object_entry_t *poStack_878;
  enum_entry_t *peStack_870;
  service_entry_t *psStack_868;
  char *pcStack_860;
  object_entry_t *poStack_858;
  enum_entry_t *peStack_850;
  service_entry_t *psStack_848;
  char *pcStack_840;
  fb_schema_t *pfStack_838;
  fb_scoped_name_t *pfStack_7a8;
  undefined8 *puStack_7a0;
  undefined8 uStack_798;
  fb_symbol_t *pfStack_790;
  fb_scoped_name_t *pfStack_788;
  char *pcStack_780;
  fb_scoped_name_t fStack_770;
  fb_scoped_name_t fStack_688;
  fb_output_t *pfStack_5a0;
  fb_scoped_name_t *pfStack_598;
  undefined8 *puStack_590;
  fb_symbol_t *pfStack_588;
  fb_scoped_name_t *pfStack_580;
  code *pcStack_578;
  fb_scoped_name_t *pfStack_570;
  fb_scoped_name_t fStack_568;
  fb_scoped_name_t fStack_480;
  ulong uStack_398;
  fb_scoped_name_t *pfStack_390;
  fb_scoped_name_t *pfStack_388;
  ulong uStack_380;
  fb_scoped_name_t *pfStack_378;
  fb_scoped_name_t *pfStack_370;
  FILE *pFStack_368;
  undefined8 uStack_360;
  FILE *pFStack_358;
  fb_scoped_name_t fStack_350;
  fb_scoped_name_t fStack_268;
  fb_output_t *pfStack_180;
  FILE *pFStack_178;
  char *pcStack_170;
  FILE *pFStack_168;
  FILE *pFStack_160;
  FILE *pFStack_158;
  FILE *pFStack_150;
  int local_13c;
  FILE *local_138;
  FILE *local_130;
  int local_124;
  int local_120;
  uint local_11c;
  fb_scoped_name_t snref;
  
  pFVar38 = (FILE *)(ulong)(uint)from_ptr;
  pFVar24 = (FILE *)CONCAT44(in_register_00000084,conversion);
  pcVar35 = snref.text;
  pcVar33 = (char *)0x0;
  pFStack_150 = (FILE *)0x1100a7;
  local_13c = conversion;
  local_124 = index;
  memset(pcVar35,0,0xe8);
  pcVar23 = "";
  if (arg_count == 1) {
    pcVar23 = "_from_pe";
  }
  pFVar14 = (FILE *)"_to_pe";
  if (arg_count != 2) {
    pFVar14 = (FILE *)pcVar23;
  }
  pfVar31 = ct->members;
  local_130 = pFVar14;
  local_120 = arg_count;
  if (pfVar31 != (fb_symbol_t *)0x0) {
    uVar17 = 0;
    pFVar36 = (FILE *)0x0;
    do {
      local_138 = (FILE *)(ulong)(uint)pfVar31->ident->len;
      pFVar37 = (FILE *)pfVar31->ident->text;
      iVar13 = (int)pFVar36;
      pFVar14 = local_138;
      if (0 < iVar13) {
        if (((ulong)pFVar36 & 3) == 0) {
          pFVar14 = (FILE *)out->fp;
          pcVar33 = (char *)0x4;
          pcVar35 = ";\n  ";
        }
        else {
          pFVar14 = (FILE *)out->fp;
          pcVar33 = &DAT_00000002;
          pcVar35 = "; ";
        }
        pFStack_150 = (FILE *)0x11013e;
        fwrite(pcVar35,(size_t)pcVar33,1,pFVar14);
      }
      iVar11 = (int)pFVar38;
      uVar2 = pfVar31[1].kind;
      if (0x10 < uVar2) {
        if (uVar2 == 0x11) {
          uVar12 = *(int *)&pfVar31[1].link - 1;
          if (0xb < uVar12) {
            pFStack_150 = (FILE *)0x1105ea;
            gen_builder_struct_field_assign_cold_2();
            goto LAB_001105ea;
          }
          if ((pfVar31[4].kind & 4) != 0) goto LAB_0011033e;
          if (local_13c == 0) {
            pcVar35 = (char *)out->fp;
            pcVar33 = "%s%s_array_copy%s(p->%.*s, v%i, %d)";
            pFStack_160 = pFVar36;
            pFStack_158 = (FILE *)(ulong)*(uint *)&pfVar31[1].field_0x14;
          }
          else {
            pcVar35 = (char *)out->fp;
            pcVar33 = "%s%s_array_copy%s(p->%.*s, p2->%.*s, %d)";
            pFStack_160 = local_138;
            pFStack_158 = pFVar37;
            pFStack_150 = (FILE *)(ulong)*(uint *)&pfVar31[1].field_0x14;
          }
          pcStack_170 = (char *)0x110440;
          pFVar36 = local_130;
          pFVar38 = local_138;
          pFStack_168 = pFVar37;
          uVar12 = fprintf((FILE *)pcVar35,pcVar33,out,(&PTR_anon_var_dwarf_447e_00153ad0)[uVar12]);
          pFVar14 = (FILE *)(ulong)uVar12;
          goto LAB_00110566;
        }
        if (uVar2 == 0x14) {
          uVar12 = *(uint *)&pfVar31[1].field_0x14;
          pFStack_150 = (FILE *)0x1101de;
          local_11c = (uint)uVar17;
          __flatcc_fb_scoped_symbol_name
                    ((fb_scope_t *)pfVar31[1].link[1].link,pfVar31[1].link,&snref);
          if ((pfVar31[4].kind & 4) != 0) {
            pcVar35 = (char *)out->fp;
            uVar17 = (ulong)local_11c;
            pFVar36 = pFVar24;
LAB_00110362:
            pFStack_150 = (FILE *)0x11036c;
            pcVar33 = "__%sstruct_clear_field(p->__deprecated%i)";
            uVar12 = fprintf((FILE *)pcVar35,"__%sstruct_clear_field(p->__deprecated%i)",out,uVar17)
            ;
            pFVar14 = (FILE *)(ulong)uVar12;
            uVar17 = (ulong)((int)uVar17 + 1);
            goto LAB_00110566;
          }
          pFVar24 = local_138;
          if (local_13c == 0) {
            pcVar35 = (char *)out->fp;
            pcVar33 = "%s_array_copy%s(p->%.*s, v%i, %d)";
            pFStack_160 = (FILE *)0x110400;
            pFStack_158 = pFVar36;
            pFStack_150 = (FILE *)(ulong)uVar12;
            uVar12 = fprintf((FILE *)pcVar35,"%s_array_copy%s(p->%.*s, v%i, %d)",&snref,local_130);
            pFVar38 = pFVar37;
          }
          else {
            pcVar35 = (char *)out->fp;
            pcVar33 = "%s_array_copy%s(p->%.*s, p2->%.*s, %d)";
            pFStack_168 = local_138;
            pcStack_170 = (char *)0x110224;
            pFStack_160 = pFVar37;
            pFStack_158 = (FILE *)(ulong)uVar12;
            uVar12 = fprintf((FILE *)pcVar35,"%s_array_copy%s(p->%.*s, p2->%.*s, %d)",&snref,
                             local_130);
            pFVar38 = pFVar37;
          }
          pFVar14 = (FILE *)(ulong)uVar12;
          pFVar41 = (FILE *)(ulong)(iVar13 + 1);
          uVar17 = (ulong)local_11c;
          goto LAB_00110569;
        }
LAB_001105ea:
        pFStack_150 = (FILE *)0x1105ef;
        gen_builder_struct_field_assign_cold_3();
LAB_001105ef:
        pFStack_150 = (FILE *)print_literal;
        gen_builder_struct_field_assign_cold_1();
        puVar25 = &switchD_00110613::switchdataD_001347a0;
        iVar13 = (int)pcVar35;
        switch(*(undefined2 *)&((FILE *)pcVar33)->_IO_read_end) {
        case 4:
          uVar44 = SUB84(*(double *)pcVar33,0);
          if (iVar13 == 0xb) {
            uVar44 = SUB84((double)(float)*(double *)pcVar33,0);
            pcVar35 = "%#.9gf";
          }
          else {
            pcVar35 = "%#.17g";
          }
          iVar13 = sprintf(__s,pcVar35,uVar44);
          return iVar13;
        case 5:
          uVar12 = iVar13 - 1;
          pcVar35 = (char *)(ulong)uVar12;
          pFVar14 = (FILE *)puVar25;
          if ((uVar12 < 0xc) && ((0x9ffU >> (uVar12 & 0x1f) & 1) != 0)) {
            puVar16 = (&PTR_anon_var_dwarf_40f7_00153b30)[(long)pcVar35];
            dVar26 = *(double *)pcVar33;
            pcVar35 = "%s(%ld)";
LAB_001106c7:
            iVar13 = sprintf(__s,pcVar35,puVar16,dVar26,extraout_RAX);
            return iVar13;
          }
          goto LAB_001106f2;
        case 6:
          uVar12 = iVar13 - 1;
          pcVar35 = (char *)(ulong)uVar12;
          if ((uVar12 < 0xc) && ((0x9ffU >> (uVar12 & 0x1f) & 1) != 0)) {
            puVar16 = (&PTR_anon_var_dwarf_40f7_00153b30)[(long)pcVar35];
            dVar26 = *(double *)pcVar33;
            pcVar35 = "%s(%lu)";
            goto LAB_001106c7;
          }
          pFStack_158 = (FILE *)0x1106ed;
          print_literal_cold_3();
          break;
        case 7:
          uVar12 = iVar13 - 1;
          pcVar35 = (char *)(ulong)uVar12;
          if ((uVar12 < 0xc) && ((0x9ffU >> (uVar12 & 0x1f) & 1) != 0)) {
            iVar13 = sprintf(__s,"%s(%u)",(&PTR_anon_var_dwarf_40f7_00153b30)[(long)pcVar35],
                             (ulong)(byte)((FILE *)pcVar33)->_flags,extraout_RAX);
            return iVar13;
          }
          break;
        default:
          goto switchD_00110613_default;
        }
        pFStack_158 = (FILE *)0x1106f2;
        print_literal_cold_1();
        pFVar14 = (FILE *)puVar25;
LAB_001106f2:
        pFStack_158 = (FILE *)0x1106f7;
        print_literal_cold_2();
switchD_00110613_default:
        pFStack_158 = (FILE *)gen_union_fields;
        print_literal_cold_4();
        pcStack_170 = "__%sstruct_clear_field(p->__deprecated%i)";
        pcVar23 = "vector_value";
        if (iVar11 == 0) {
          pcVar23 = "value";
        }
        pfStack_370 = (fb_scoped_name_t *)0x11074a;
        pFStack_368 = (FILE *)pcVar33;
        uStack_360 = extraout_RDX;
        pFStack_358 = pFVar14;
        pfStack_180 = out;
        pFStack_178 = pFVar37;
        pFStack_168 = (FILE *)uVar17;
        pFStack_160 = pFVar36;
        pFStack_158 = (FILE *)pfVar31;
        memset(&fStack_350,0,0xe8);
        pfStack_370 = (fb_scoped_name_t *)0x11075e;
        memset(&fStack_268,0,0xe8);
        pfVar27 = (fb_output_t *)pFVar24->_IO_read_base;
        pfStack_370 = (fb_scoped_name_t *)0x11076d;
        __flatcc_fb_scoped_symbol_name((fb_scope_t *)pfVar27,(fb_symbol_t *)pFVar24,&fStack_350);
        pcVar33 = pFVar24->_IO_write_ptr;
        uVar17 = extraout_RAX_00;
        goto LAB_00110771;
      }
      if (uVar2 == 9) {
        uVar12 = *(int *)&pfVar31[1].link - 1;
        if (0xb < uVar12) goto LAB_001105ef;
        if ((pfVar31[4].kind & 4) != 0) {
LAB_0011033e:
          pcVar35 = (char *)out->fp;
          pFVar36 = pFVar24;
          goto LAB_00110362;
        }
        pFVar24 = (FILE *)(&PTR_anon_var_dwarf_447e_00153ad0)[uVar12];
        iVar11 = local_120;
        if (pfVar31[5].ident == (fb_token_t *)&DAT_00000001) {
          iVar11 = 0;
        }
        pfVar27 = out;
        if (iVar11 == 2) {
          if (local_13c == 0) {
            pcVar35 = (char *)out->fp;
            pcVar33 = "%s%s_assign_to_pe(&p->%.*s, v%i)";
            pFStack_158 = pFVar36;
          }
          else {
            pcVar35 = (char *)out->fp;
            pcVar33 = "%s%s_copy_to_pe(&p->%.*s, &p2->%.*s)";
LAB_00110465:
            pFStack_158 = local_138;
            pFStack_150 = pFVar37;
          }
        }
        else {
          if (iVar11 != 1) {
LAB_001103a2:
            if (local_13c == 0) {
              pcVar35 = (char *)out->fp;
              pcVar33 = "p->%.*s = v%i";
              pFStack_150 = (FILE *)0x1104ee;
              uVar12 = fprintf((FILE *)pcVar35,"p->%.*s = v%i",local_138,pFVar37);
              pFVar14 = (FILE *)(ulong)uVar12;
            }
            else {
              pcVar35 = (char *)out->fp;
              pcVar33 = "p->%.*s = p2->%.*s";
              pFVar36 = (FILE *)((ulong)local_138 & 0xffffffff);
              pFStack_150 = (FILE *)0x1103d0;
              uVar12 = fprintf((FILE *)pcVar35,"p->%.*s = p2->%.*s",local_138,pFVar37);
              pFVar14 = (FILE *)(ulong)uVar12;
              pFVar38 = pFVar37;
            }
            goto LAB_00110566;
          }
          if (local_13c != 0) {
            pcVar35 = (char *)out->fp;
            pcVar33 = "%s%s_copy_from_pe(&p->%.*s, &p2->%.*s)";
            goto LAB_00110465;
          }
          pcVar35 = (char *)out->fp;
          pcVar33 = "%s%s_assign_from_pe(&p->%.*s, v%i)";
          pFStack_158 = pFVar36;
        }
        pFStack_160 = (FILE *)0x110562;
        pFVar14 = local_138;
        pFVar38 = pFVar37;
        uVar12 = fprintf((FILE *)pcVar35,pcVar33,pfVar27,pFVar24);
        pFVar37 = pFVar14;
      }
      else {
        if (uVar2 != 0xf) goto LAB_001105ea;
        pFStack_150 = (FILE *)0x11016b;
        __flatcc_fb_scoped_symbol_name((fb_scope_t *)pfVar31[1].link[1].link,pfVar31[1].link,&snref)
        ;
        if ((pfVar31[1].link)->kind == 1) {
          if ((pfVar31[4].kind & 4) == 0) {
            if (local_13c != 0) {
              pcVar35 = (char *)out->fp;
              pcVar33 = "%s_copy%s(&p->%.*s, &p2->%.*s)";
              pFVar24 = local_130;
              pfVar27 = (fb_output_t *)&snref;
              goto LAB_00110465;
            }
            pFStack_150 = (FILE *)0x11049f;
            fprintf((FILE *)out->fp,"%s_assign%s(&p->%.*s",&snref,local_130);
            pFVar24 = (FILE *)0x0;
            pFStack_150 = (FILE *)0x1104b5;
            uVar12 = gen_builder_struct_call_list
                               (out,(fb_compound_type_t *)pfVar31[1].link,iVar13,local_124,0);
            pFVar41 = (FILE *)(ulong)uVar12;
            pcVar33 = (char *)out->fp;
            pcVar35 = (char *)0x29;
            pFStack_150 = (FILE *)0x1104c9;
            uVar12 = fputc(0x29,(FILE *)pcVar33);
            pFVar14 = (FILE *)(ulong)uVar12;
            pFVar38 = pFVar37;
          }
          else {
            pFStack_150 = (FILE *)0x11038b;
            pcVar33 = "__%sstruct_clear_field(p->__deprecated%i)";
            fprintf((FILE *)out->fp,"__%sstruct_clear_field(p->__deprecated%i)",out,uVar17);
            uVar17 = (ulong)((uint)uVar17 + 1);
            pcVar35 = (char *)pfVar31[1].link;
            pFStack_150 = (FILE *)0x110397;
            iVar11 = get_total_struct_field_count((fb_compound_type_t *)pcVar35);
            pFVar14 = (FILE *)(ulong)(uint)(iVar11 + iVar13);
            pFVar41 = (FILE *)(ulong)(uint)(iVar11 + iVar13);
          }
          goto LAB_00110569;
        }
        if ((pfVar31[4].kind & 4) != 0) goto LAB_0011033e;
        iVar11 = local_120;
        if (pfVar31[5].ident == (fb_token_t *)&DAT_00000001) {
          iVar11 = 0;
        }
        if (iVar11 == 2) {
          if (local_13c == 0) {
            pcVar35 = (char *)out->fp;
            pcVar33 = "%s%s_assign_to_pe(&p->%.*s, v%i)";
LAB_00110596:
            pcVar33 = pcVar33 + 2;
            pFStack_150 = (FILE *)0x1105ad;
            pFVar38 = pFVar36;
            uVar12 = fprintf((FILE *)pcVar35,pcVar33,&snref,local_138);
            pFVar14 = (FILE *)(ulong)uVar12;
            pFVar36 = pFVar37;
            goto LAB_00110566;
          }
          pcVar35 = (char *)out->fp;
          pcVar33 = "%s%s_copy_to_pe(&p->%.*s, &p2->%.*s)";
        }
        else {
          if (iVar11 != 1) goto LAB_001103a2;
          if (local_13c == 0) {
            pcVar35 = (char *)out->fp;
            pcVar33 = "%s%s_assign_from_pe(&p->%.*s, v%i)";
            goto LAB_00110596;
          }
          pcVar35 = (char *)out->fp;
          pcVar33 = "%s%s_copy_from_pe(&p->%.*s, &p2->%.*s)";
        }
        pcVar33 = pcVar33 + 2;
        pFVar38 = (FILE *)((ulong)local_138 & 0xffffffff);
        pFStack_160 = (FILE *)0x110526;
        pFStack_158 = pFVar37;
        uVar12 = fprintf((FILE *)pcVar35,pcVar33,&snref);
      }
      pFVar14 = (FILE *)(ulong)uVar12;
      pFVar36 = pFVar37;
LAB_00110566:
      pFVar41 = (FILE *)(ulong)(iVar13 + 1);
      pFVar24 = pFVar36;
LAB_00110569:
      pfVar31 = pfVar31->link;
      pFVar36 = pFVar41;
    } while (pfVar31 != (fb_symbol_t *)0x0);
  }
  iVar13 = (int)pFVar14;
  if (0 < local_124) {
    pFStack_150 = (FILE *)0x1105d3;
    sVar15 = fwrite(";\n  ",4,1,(FILE *)out->fp);
    iVar13 = (int)sVar15;
  }
  return iVar13;
LAB_00110771:
  if (pcVar33 == (char *)0x0) {
    return (int)uVar17;
  }
  uVar2 = *(ushort *)(pcVar33 + 0x28);
  uVar17 = (ulong)uVar2;
  if (uVar2 == 0) goto LAB_00110855;
  uVar17 = (ulong)*(uint *)(*(undefined8 **)(pcVar33 + 8) + 1);
  uVar28 = **(undefined8 **)(pcVar33 + 8);
  if (uVar2 == 0xb) {
    pfVar27 = (fb_output_t *)((fb_scoped_name_t *)pcVar35)->scope;
    __format = "__%sbuild_union_string_%s_field(%s, %s_%.*s, %s, %.*s)\n";
LAB_0011083a:
    pfStack_388 = &fStack_350;
    pfStack_390 = (fb_scoped_name_t *)pFStack_358;
    uStack_398 = uStack_360;
    fStack_480.total_len = 0x110851;
    fStack_480._228_4_ = 0;
    uStack_380 = uVar17;
    pfStack_378 = (fb_scoped_name_t *)uVar28;
    uVar12 = fprintf((FILE *)pfVar27,__format,pcVar35,pcVar23,pcVar35,pFStack_368);
    uVar17 = (ulong)uVar12;
    goto LAB_00110855;
  }
  if (uVar2 == 0xf) {
    pfVar27 = (fb_output_t *)(*(fb_symbol_t **)(pcVar33 + 0x18))[1].link;
    pfStack_370 = (fb_scoped_name_t *)0x1107b6;
    __flatcc_fb_scoped_symbol_name
              ((fb_scope_t *)pfVar27,*(fb_symbol_t **)(pcVar33 + 0x18),&fStack_268);
    if (*(short *)(*(long *)(pcVar33 + 0x18) + 0x10) == 1) {
      pfVar27 = (fb_output_t *)((fb_scoped_name_t *)pcVar35)->scope;
      __format = "__%sbuild_union_struct_%s_field(%s, %s_%.*s, %s, %.*s, %s)\n";
      pfStack_370 = &fStack_268;
    }
    else {
      if (*(short *)(*(long *)(pcVar33 + 0x18) + 0x10) != 0) goto LAB_00110875;
      pfVar27 = (fb_output_t *)((fb_scoped_name_t *)pcVar35)->scope;
      __format = "__%sbuild_union_table_%s_field(%s, %s_%.*s, %s, %.*s, %s)\n";
      pfStack_370 = &fStack_268;
    }
    goto LAB_0011083a;
  }
  pfStack_370 = (fb_scoped_name_t *)0x110875;
  gen_union_fields_cold_2();
LAB_00110875:
  pfStack_370 = (fb_scoped_name_t *)0x11087a;
  gen_union_fields_cold_1();
  pcStack_578 = (code *)0x1108b6;
  uStack_398 = uVar17;
  pfStack_390 = (fb_scoped_name_t *)pcVar35;
  pfStack_388 = (fb_scoped_name_t *)pcVar23;
  uStack_380 = uVar28;
  pfStack_378 = &fStack_268;
  pfStack_370 = (fb_scoped_name_t *)pcVar33;
  fprintf((FILE *)pfVar27->fp,"#ifndef %s_VERIFIER_H\n#define %s_VERIFIER_H\n",
          pfVar27->S->basenameup);
  pcStack_578 = (code *)0x1108d3;
  fwrite("\n/* Generated by flatcc 0.6.2 FlatBuffers schema compiler for C by dvide.com */\n\n",0x51
         ,1,(FILE *)pfVar27->fp);
  pcStack_578 = (code *)0x1108f6;
  fprintf((FILE *)pfVar27->fp,"#ifndef %s_READER_H\n",pfVar27->S->basenameup);
  pcStack_578 = (code *)0x110919;
  fprintf((FILE *)pfVar27->fp,"#include \"%s_reader.h\"\n",pfVar27->S->basename);
  pcStack_578 = (code *)0x110936;
  fwrite("#endif\n",7,1,(FILE *)pfVar27->fp);
  pcStack_578 = (code *)0x110953;
  fwrite("#include \"flatcc/flatcc_verifier.h\"\n",0x24,1,(FILE *)pfVar27->fp);
  pcStack_578 = (code *)0x110969;
  __flatcc_fb_gen_c_includes(pfVar27,"_verifier.h","_VERIFIER_H");
  if (pfVar27->opts->cgen_pragmas != 0) {
    pcStack_578 = (code *)0x110996;
    fwrite("#include \"flatcc/flatcc_prologue.h\"\n",0x24,1,(FILE *)pfVar27->fp);
  }
  pcStack_578 = (code *)0x1109a7;
  fputc(10,(FILE *)pfVar27->fp);
  pcStack_578 = (code *)0x1109bb;
  memset(&fStack_480,0,0xe8);
  pfVar31 = pfVar27->S->symbols;
  if (pfVar31 != (fb_symbol_t *)0x0) {
    do {
      if (pfVar31->kind == 0) {
        pcStack_578 = (code *)0x1109f1;
        __flatcc_fb_scoped_symbol_name((fb_scope_t *)pfVar31[1].link,pfVar31,&fStack_480);
        pcStack_578 = (code *)0x110a05;
        fprintf((FILE *)pfVar27->fp,
                "static int %s_verify_table(flatcc_table_verifier_descriptor_t *td);\n",&fStack_480)
        ;
      }
      pfVar31 = pfVar31->link;
    } while (pfVar31 != (fb_symbol_t *)0x0);
  }
  pcStack_578 = (code *)0x110a1e;
  fputc(10,(FILE *)pfVar27->fp);
  pfVar31 = pfVar27->S->symbols;
  if (pfVar31 != (fb_symbol_t *)0x0) {
    sn = &fStack_568;
    do {
      if (pfVar31->kind == 4) {
        pcStack_578 = (code *)0x110a5a;
        memset(&fStack_480,0,0xe8);
        pcStack_578 = (code *)0x110a69;
        memset(sn,0,0xe8);
        pcStack_578 = (code *)0x110a78;
        __flatcc_fb_scoped_symbol_name((fb_scope_t *)pfVar31[1].link,pfVar31,&fStack_480);
        __stream = (fb_scoped_name_t *)pfVar27->fp;
        pcStack_578 = (code *)0x110a90;
        fprintf((FILE *)__stream,
                "static int %s_union_verifier(flatcc_union_verifier_descriptor_t *ud)\n{\n    switch (ud->type) {\n"
                ,&fStack_480);
        for (puVar39 = *(undefined8 **)&pfVar31[1].kind; puVar39 != (undefined8 *)0x0;
            puVar39 = (undefined8 *)*puVar39) {
          sVar3 = *(short *)(puVar39 + 5);
          if (sVar3 != 0) {
            uVar12 = *(uint *)((undefined8 *)puVar39[1] + 1);
            pcVar35 = (char *)(ulong)uVar12;
            pfVar42 = *(fb_scoped_name_t **)puVar39[1];
            if (sVar3 == 0xb) {
              __stream = (fb_scoped_name_t *)pfVar27->fp;
              pcStack_578 = (code *)0x110b29;
              fprintf((FILE *)__stream,
                      "    case %u: return flatcc_verify_union_string(ud); /* %.*s */\n",
                      (ulong)*(uint *)(puVar39 + 9),pcVar35);
            }
            else {
              if (sVar3 != 0xf) {
                pcStack_578 = (code *)0x111229;
                __flatcc_fb_gen_c_verifier_cold_2();
LAB_00111229:
                pcStack_578 = (code *)0x11122e;
                __flatcc_fb_gen_c_verifier_cold_1();
                goto switchD_00110ed8_caseD_2;
              }
              __stream = (fb_scoped_name_t *)((fb_symbol_t *)puVar39[3])[1].link;
              pcStack_578 = (code *)0x110ad2;
              __flatcc_fb_scoped_symbol_name((fb_scope_t *)__stream,(fb_symbol_t *)puVar39[3],sn);
              lVar40 = puVar39[3];
              if (*(short *)(lVar40 + 0x10) == 1) {
                __stream = (fb_scoped_name_t *)pfVar27->fp;
                pcStack_578 = (code *)0x110b5a;
                pfStack_570 = pfVar42;
                fprintf((FILE *)__stream,
                        "    case %u: return flatcc_verify_union_struct(ud, %lu, %u); /* %.*s */\n",
                        (ulong)*(uint *)(puVar39 + 9),*(undefined8 *)(lVar40 + 0xc0),
                        (ulong)*(ushort *)(lVar40 + 0xb8),pcVar35);
              }
              else {
                if (*(short *)(lVar40 + 0x10) != 0) goto LAB_00111229;
                __stream = (fb_scoped_name_t *)pfVar27->fp;
                pcStack_578 = (code *)0x110b09;
                fprintf((FILE *)__stream,
                        "    case %u: return flatcc_verify_union_table(ud, %s_verify_table); /* %.*s */\n"
                        ,(ulong)*(uint *)(puVar39 + 9),sn,(ulong)uVar12,pfVar42);
              }
            }
          }
        }
        pcStack_578 = (code *)0x110b80;
        fwrite("    default: return flatcc_verify_ok;\n    }\n}\n\n",0x2f,1,(FILE *)pfVar27->fp);
      }
      pfVar31 = pfVar31->link;
    } while (pfVar31 != (fb_symbol_t *)0x0);
  }
  pfVar31 = pfVar27->S->symbols;
  if (pfVar31 != (fb_symbol_t *)0x0) {
    do {
      if (pfVar31->kind == 1) {
        pcStack_578 = (code *)0x110bd8;
        memset(&fStack_480,0,0xe8);
        pcStack_578 = (code *)0x110be7;
        __flatcc_fb_scoped_symbol_name((fb_scope_t *)pfVar31[1].link,pfVar31,&fStack_480);
        pcStack_578 = (code *)0x110c11;
        fprintf((FILE *)pfVar27->fp,
                "static inline int %s_verify_as_root(const void *buf, size_t bufsiz)\n{\n    return flatcc_verify_struct_as_root(buf, bufsiz, %s_identifier, %lu, %u);\n}\n\n"
                ,&fStack_480,&fStack_480,pfVar31[8].link,(ulong)pfVar31[7].kind);
        pcStack_578 = (code *)0x110c3b;
        fprintf((FILE *)pfVar27->fp,
                "static inline int %s_verify_as_root_with_size(const void *buf, size_t bufsiz)\n{\n    return flatcc_verify_struct_as_root_with_size(buf, bufsiz, %s_identifier, %lu, %u);\n}\n\n"
                ,&fStack_480,&fStack_480,pfVar31[8].link,(ulong)pfVar31[7].kind);
        pcStack_578 = (code *)0x110c65;
        fprintf((FILE *)pfVar27->fp,
                "static inline int %s_verify_as_typed_root(const void *buf, size_t bufsiz)\n{\n    return flatcc_verify_struct_as_typed_root(buf, bufsiz, %s_type_hash, %lu, %u);\n}\n\n"
                ,&fStack_480,&fStack_480,pfVar31[8].link,(ulong)pfVar31[7].kind);
        pcStack_578 = (code *)0x110c8f;
        fprintf((FILE *)pfVar27->fp,
                "static inline int %s_verify_as_typed_root_with_size(const void *buf, size_t bufsiz)\n{\n    return flatcc_verify_struct_as_typed_root_with_size(buf, bufsiz, %s_type_hash, %lu, %u);\n}\n\n"
                ,&fStack_480,&fStack_480,pfVar31[8].link,(ulong)pfVar31[7].kind);
        pcStack_578 = (code *)0x110cb9;
        fprintf((FILE *)pfVar27->fp,
                "static inline int %s_verify_as_root_with_type_hash(const void *buf, size_t bufsiz, %sthash_t thash)\n{\n    return flatcc_verify_struct_as_typed_root(buf, bufsiz, thash, %lu, %u);\n}\n\n"
                ,&fStack_480,pfVar27,pfVar31[8].link,(ulong)pfVar31[7].kind);
        pcStack_578 = (code *)0x110cdf;
        fprintf((FILE *)pfVar27->fp,
                "static inline int %s_verify_as_root_with_type_hash_and_size(const void *buf, size_t bufsiz, %sthash_t thash)\n{\n    return flatcc_verify_struct_as_typed_root_with_size(buf, bufsiz, thash, %lu, %u);\n}\n\n"
                ,&fStack_480,pfVar27,pfVar31[8].link,(ulong)pfVar31[7].kind);
        pcStack_578 = (code *)0x110d02;
        fprintf((FILE *)pfVar27->fp,
                "static inline int %s_verify_as_root_with_identifier(const void *buf, size_t bufsiz, const char *fid)\n{\n    return flatcc_verify_struct_as_root(buf, bufsiz, fid, %lu, %u);\n}\n\n"
                ,&fStack_480,pfVar31[8].link,(ulong)pfVar31[7].kind);
        pcStack_578 = (code *)0x110d25;
        fprintf((FILE *)pfVar27->fp,
                "static inline int %s_verify_as_root_with_identifier_and_size(const void *buf, size_t bufsiz, const char *fid)\n{\n    return flatcc_verify_struct_as_root_with_size(buf, bufsiz, fid, %lu, %u);\n}\n\n"
                ,&fStack_480,pfVar31[8].link);
      }
      pfVar31 = pfVar31->link;
    } while (pfVar31 != (fb_symbol_t *)0x0);
  }
  pfVar31 = pfVar27->S->symbols;
  if (pfVar31 == (fb_symbol_t *)0x0) goto LAB_001111c0;
  pcVar35 = ")) return ret;\n    if ((ret = ";
LAB_00110d59:
  if (pfVar31->kind != 0) goto LAB_001111b4;
  pcStack_578 = (code *)0x110d74;
  memset(&fStack_480,0,0xe8);
  pcStack_578 = (code *)0x110d83;
  memset(&fStack_568,0,0xe8);
  pcStack_578 = (code *)0x110d92;
  __flatcc_fb_scoped_symbol_name((fb_scope_t *)pfVar31[1].link,pfVar31,&fStack_480);
  pcStack_578 = (code *)0x110daa;
  fprintf((FILE *)pfVar27->fp,
          "static int %s_verify_table(flatcc_table_verifier_descriptor_t *td)\n{\n",&fStack_480);
  puVar39 = *(undefined8 **)&pfVar31[1].kind;
  if (puVar39 == (undefined8 *)0x0) goto LAB_00111090;
  bVar43 = true;
LAB_00110dbd:
  pfVar42 = &fStack_480;
  if ((*(byte *)(puVar39 + 0xe) & 4) != 0) goto LAB_0011105c;
  if (bVar43) {
    sVar15 = 0x1c;
    pcVar33 = "    int ret;\n    if ((ret = ";
  }
  else {
    sVar15 = 0x1e;
    pcVar33 = pcVar35;
  }
  pcStack_578 = (code *)0x110df9;
  fwrite(pcVar33,sVar15,1,(FILE *)pfVar27->fp);
  if (8 < *(ushort *)(puVar39 + 5) - 8) goto switchD_00110e24_caseD_c;
  sn = (fb_scoped_name_t *)(ulong)(*(uint *)(puVar39 + 0xe) >> 8 & 1);
  switch((uint)*(ushort *)(puVar39 + 5)) {
  case 8:
    pfVar6 = (fb_symbol_t *)puVar39[0x12];
    if (pfVar6 == (fb_symbol_t *)0x0) {
switchD_00110ed8_caseD_1:
      lVar40 = puVar39[0x10];
      auVar9._8_8_ = 0;
      auVar9._0_8_ = lVar40 + (ulong)(lVar40 == 0);
      pfStack_570 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffff)) / auVar9,0);
      pcStack_578 = (code *)0x110f21;
      fprintf((FILE *)pfVar27->fp,"flatcc_verify_vector_field(td, %lu, %d, %lu, %u, INT64_C(%lu))",
              puVar39[0x11],sn,lVar40,(ulong)*(ushort *)((long)puVar39 + 0x72));
    }
    else {
      pcStack_578 = (code *)0x110e4a;
      __flatcc_fb_scoped_symbol_name((fb_scope_t *)pfVar6[1].link,pfVar6,&fStack_568);
      if (*(short *)(puVar39[0x12] + 0x10) == 0) {
        pcStack_578 = (code *)0x11102f;
        fprintf((FILE *)pfVar27->fp,
                "flatcc_verify_table_as_nested_root(td, %lu, %u, 0, %u, %s_verify_table)",
                puVar39[0x11],sn,(ulong)*(ushort *)((long)puVar39 + 0x72),&fStack_568);
      }
      else {
        pcStack_578 = (code *)0x110e87;
        fprintf((FILE *)pfVar27->fp,"flatcc_verify_struct_as_nested_root(td, %lu, %u, 0, %lu,  %u)",
                puVar39[0x11],sn,puVar39[0x10],(ulong)*(ushort *)((long)puVar39 + 0x72));
      }
    }
    break;
  case 9:
switchD_00110e24_caseD_9:
    pcStack_578 = (code *)0x110fa6;
    fprintf((FILE *)pfVar27->fp,"flatcc_verify_field(td, %lu, %lu, %u)",puVar39[0x11],puVar39[0x10])
    ;
    break;
  case 10:
    pFVar24 = (FILE *)pfVar27->fp;
    uVar28 = puVar39[0x11];
    pcVar33 = "flatcc_verify_string_vector_field(td, %lu, %d)";
    goto LAB_00110f3b;
  case 0xb:
    pFVar24 = (FILE *)pfVar27->fp;
    uVar28 = puVar39[0x11];
    pcVar33 = "flatcc_verify_string_field(td, %lu, %d)";
LAB_00110f3b:
    pcStack_578 = (code *)0x110f45;
    fprintf(pFVar24,pcVar33,uVar28,sn);
    break;
  case 0xf:
    __stream = (fb_scoped_name_t *)((fb_symbol_t *)puVar39[3])[1].link;
    pcStack_578 = (code *)0x110f5c;
    __flatcc_fb_scoped_symbol_name((fb_scope_t *)__stream,(fb_symbol_t *)puVar39[3],&fStack_568);
    switch(*(undefined2 *)(puVar39[3] + 0x10)) {
    case 0:
      pFVar24 = (FILE *)pfVar27->fp;
      uVar28 = puVar39[0x11];
      pcVar33 = "flatcc_verify_table_field(td, %lu, %d, &%s_verify_table)";
      break;
    case 1:
    case 3:
      goto switchD_00110e24_caseD_9;
    default:
      goto switchD_00110f7c_caseD_2;
    case 4:
      pFVar24 = (FILE *)pfVar27->fp;
      uVar28 = puVar39[0x11];
      pcVar33 = "flatcc_verify_union_field(td, %lu, %d, &%s_union_verifier)";
    }
    goto LAB_00111005;
  case 0x10:
    __stream = (fb_scoped_name_t *)((fb_symbol_t *)puVar39[3])[1].link;
    pcStack_578 = (code *)0x110eb8;
    __flatcc_fb_scoped_symbol_name((fb_scope_t *)__stream,(fb_symbol_t *)puVar39[3],&fStack_568);
    switch(*(undefined2 *)(puVar39[3] + 0x10)) {
    case 0:
      pFVar24 = (FILE *)pfVar27->fp;
      uVar28 = puVar39[0x11];
      pcVar33 = "flatcc_verify_table_vector_field(td, %lu, %d, &%s_verify_table)";
      break;
    case 1:
    case 3:
      goto switchD_00110ed8_caseD_1;
    default:
      goto switchD_00110ed8_caseD_2;
    case 4:
      pFVar24 = (FILE *)pfVar27->fp;
      uVar28 = puVar39[0x11];
      pcVar33 = "flatcc_verify_union_vector_field(td, %lu, %d, &%s_union_verifier)";
    }
LAB_00111005:
    pcStack_578 = (code *)0x111014;
    fprintf(pFVar24,pcVar33,uVar28,sn);
  }
switchD_00110e24_caseD_c:
  bVar43 = false;
  pcStack_578 = (code *)0x11105c;
  fprintf((FILE *)pfVar27->fp," /* %.*s */",(ulong)*(uint *)((undefined8 *)puVar39[1] + 1),
          *(undefined8 *)puVar39[1]);
LAB_0011105c:
  puVar39 = (undefined8 *)*puVar39;
  if (puVar39 == (undefined8 *)0x0) goto code_r0x00111069;
  goto LAB_00110dbd;
LAB_00110855:
  pcVar33 = *(char **)pcVar33;
  goto LAB_00110771;
code_r0x00111069:
  if (!bVar43) {
    pcStack_578 = (code *)0x111090;
    fwrite(")) return ret;\n",0xf,1,(FILE *)pfVar27->fp);
  }
LAB_00111090:
  pcStack_578 = (code *)0x1110ad;
  fwrite("    return flatcc_verify_ok;\n",0x1d,1,(FILE *)pfVar27->fp);
  pcStack_578 = (code *)0x1110ca;
  fwrite("}\n\n",3,1,(FILE *)pfVar27->fp);
  pcStack_578 = (code *)0x1110e8;
  fprintf((FILE *)pfVar27->fp,
          "static inline int %s_verify_as_root(const void *buf, size_t bufsiz)\n{\n    return flatcc_verify_table_as_root(buf, bufsiz, %s_identifier, &%s_verify_table);\n}\n\n"
          ,&fStack_480,&fStack_480,&fStack_480);
  pcStack_578 = (code *)0x111106;
  fprintf((FILE *)pfVar27->fp,
          "static inline int %s_verify_as_root_with_size(const void *buf, size_t bufsiz)\n{\n    return flatcc_verify_table_as_root_with_size(buf, bufsiz, %s_identifier, &%s_verify_table);\n}\n\n"
          ,&fStack_480,&fStack_480,&fStack_480);
  pcStack_578 = (code *)0x111124;
  fprintf((FILE *)pfVar27->fp,
          "static inline int %s_verify_as_typed_root(const void *buf, size_t bufsiz)\n{\n    return flatcc_verify_table_as_root(buf, bufsiz, %s_type_identifier, &%s_verify_table);\n}\n\n"
          ,&fStack_480,&fStack_480,&fStack_480);
  pcStack_578 = (code *)0x111142;
  fprintf((FILE *)pfVar27->fp,
          "static inline int %s_verify_as_typed_root_with_size(const void *buf, size_t bufsiz)\n{\n    return flatcc_verify_table_as_root_with_size(buf, bufsiz, %s_type_identifier, &%s_verify_table);\n}\n\n"
          ,&fStack_480,&fStack_480,&fStack_480);
  pcStack_578 = (code *)0x11115d;
  fprintf((FILE *)pfVar27->fp,
          "static inline int %s_verify_as_root_with_identifier(const void *buf, size_t bufsiz, const char *fid)\n{\n    return flatcc_verify_table_as_root(buf, bufsiz, fid, &%s_verify_table);\n}\n\n"
          ,&fStack_480,&fStack_480);
  pcStack_578 = (code *)0x111178;
  fprintf((FILE *)pfVar27->fp,
          "static inline int %s_verify_as_root_with_identifier_and_size(const void *buf, size_t bufsiz, const char *fid)\n{\n    return flatcc_verify_table_as_root_with_size(buf, bufsiz, fid, &%s_verify_table);\n}\n\n"
          ,&fStack_480,&fStack_480);
  pcStack_578 = (code *)0x111196;
  fprintf((FILE *)pfVar27->fp,
          "static inline int %s_verify_as_root_with_type_hash(const void *buf, size_t bufsiz, %sthash_t thash)\n{\n    return flatcc_verify_table_as_typed_root(buf, bufsiz, thash, &%s_verify_table);\n}\n\n"
          ,&fStack_480,pfVar27,&fStack_480);
  pcStack_578 = (code *)0x1111b4;
  fprintf((FILE *)pfVar27->fp,
          "static inline int %s_verify_as_root_with_type_hash_and_size(const void *buf, size_t bufsiz, %sthash_t thash)\n{\n    return flatcc_verify_table_as_typed_root_with_size(buf, bufsiz, thash, &%s_verify_table);\n}\n\n"
          ,&fStack_480,pfVar27);
LAB_001111b4:
  pfVar31 = pfVar31->link;
  if (pfVar31 == (fb_symbol_t *)0x0) {
LAB_001111c0:
    if (pfVar27->opts->cgen_pragmas != 0) {
      pcStack_578 = (code *)0x1111ed;
      fwrite("#include \"flatcc/flatcc_epilogue.h\"\n",0x24,1,(FILE *)pfVar27->fp);
    }
    pcStack_578 = (code *)0x111210;
    fprintf((FILE *)pfVar27->fp,"#endif /* %s_VERIFIER_H */\n",pfVar27->S->basenameup);
    return 0;
  }
  goto LAB_00110d59;
switchD_00110ed8_caseD_2:
  pcStack_578 = (code *)0x111233;
  __flatcc_fb_gen_c_verifier_cold_3();
switchD_00110f7c_caseD_2:
  pcStack_578 = __flatcc_fb_gen_c_sorter;
  __flatcc_fb_gen_c_verifier_cold_4();
  lVar40 = *(long *)&__stream->scope_len;
  puVar5 = *(undefined8 **)(lVar40 + 0x40);
  for (puVar34 = puVar5; puVar34 != (undefined8 *)0x0; puVar34 = (undefined8 *)*puVar34) {
    if ((*(ushort *)(puVar34 + 2) & 0xfffb) == 0) {
      for (puVar29 = (undefined8 *)puVar34[5]; puVar29 != (undefined8 *)0x0;
          puVar29 = (undefined8 *)*puVar29) {
        if ((ushort)((short)*(undefined4 *)(puVar29 + 5) - 0xfU) < 2) {
          *(undefined8 *)(puVar29[3] + 0xd0) = 0;
        }
      }
      puVar34[0x1a] = 0;
    }
  }
  iVar13 = 0;
  do {
    iVar11 = 0;
    if (puVar5 != (undefined8 *)0x0) {
      iVar11 = 0;
      puVar34 = puVar5;
      do {
        if ((*(ushort *)(puVar34 + 2) & 0xfffb) == 0) {
          for (puVar29 = (undefined8 *)puVar34[5]; puVar29 != (undefined8 *)0x0;
              puVar29 = (undefined8 *)*puVar29) {
            if ((*(ushort *)(puVar29 + 0xe) & 4) == 0) {
              if ((*(ushort *)(puVar29 + 0xe) >> 0xd & 1) != 0) {
                *(byte *)(puVar34 + 0x1a) = *(byte *)(puVar34 + 0x1a) | 1;
              }
              if ((((*(short *)(puVar29 + 5) == 0x10) || (*(short *)(puVar29 + 5) == 0xf)) &&
                  ((*(ushort *)(puVar29[3] + 0x10) & 0xfffb) == 0)) &&
                 ((*(byte *)(puVar29[3] + 0xd0) & 3) != 0)) {
                *(byte *)(puVar34 + 0x1a) = *(byte *)(puVar34 + 0x1a) | 1;
              }
            }
          }
          iVar11 = (iVar11 + 1) - (uint)((*(byte *)(puVar34 + 0x1a) & 3) == 0);
        }
        puVar34 = (undefined8 *)*puVar34;
      } while (puVar34 != (undefined8 *)0x0);
    }
    bVar43 = iVar13 != iVar11;
    iVar13 = iVar11;
  } while (bVar43);
  pcStack_780 = (char *)0x111363;
  pfStack_5a0 = pfVar27;
  pfStack_598 = sn;
  puStack_590 = puVar39;
  pfStack_588 = pfVar31;
  pfStack_580 = pfVar42;
  pcStack_578 = (code *)pcVar35;
  memset(&fStack_688,0,0xe8);
  pfVar31 = *(fb_symbol_t **)(lVar40 + 0x40);
  if (pfVar31 != (fb_symbol_t *)0x0) {
    do {
      if ((pfVar31->kind == 0) && ((pfVar31[8].kind & 3) != 0)) {
        pcStack_780 = (char *)0x11139c;
        __flatcc_fb_scoped_symbol_name((fb_scope_t *)pfVar31[1].link,pfVar31,&fStack_688);
        pcStack_780 = (char *)0x1113b3;
        fprintf((FILE *)__stream->scope,"static void %s_sort(%s_mutable_table_t t);\n",&fStack_688,
                &fStack_688);
      }
      pfVar31 = pfVar31->link;
    } while (pfVar31 != (fb_symbol_t *)0x0);
  }
  pcStack_780 = (char *)0x1113cc;
  fputc(10,(FILE *)__stream->scope);
  pfVar31 = *(fb_symbol_t **)(*(long *)&__stream->scope_len + 0x40);
  if (pfVar31 != (fb_symbol_t *)0x0) {
    do {
      if ((pfVar31->kind == 4) && ((pfVar31[8].kind & 3) != 0)) {
        pcStack_780 = (char *)0x111416;
        memset(&fStack_688,0,0xe8);
        pcStack_780 = (char *)0x111425;
        memset(&fStack_770,0,0xe8);
        pcStack_780 = (char *)0x111434;
        __flatcc_fb_scoped_symbol_name((fb_scope_t *)pfVar31[1].link,pfVar31,&fStack_688);
        pcStack_780 = (char *)0x11144f;
        fprintf((FILE *)__stream->scope,
                "static void %s_sort(%s_mutable_union_t u)\n{\n    switch (u.type) {\n",&fStack_688,
                &fStack_688);
        for (puVar39 = *(undefined8 **)&pfVar31[1].kind; puVar39 != (undefined8 *)0x0;
            puVar39 = (undefined8 *)*puVar39) {
          if (*(short *)(puVar39 + 5) == 0xf) {
            uVar12 = *(uint *)((undefined8 *)puVar39[1] + 1);
            uVar28 = *(undefined8 *)puVar39[1];
            pcStack_780 = (char *)0x11147a;
            __flatcc_fb_scoped_symbol_name
                      ((fb_scope_t *)((fb_symbol_t *)puVar39[3])[1].link,(fb_symbol_t *)puVar39[3],
                       &fStack_770);
            if ((*(short *)(puVar39[3] + 0x10) == 0) && ((*(byte *)(puVar39[3] + 0xd0) & 3) != 0)) {
              pcStack_780 = (char *)0x1114b3;
              fprintf((FILE *)__stream->scope,"    case %s_%.*s: %s_sort(u.value); break;\n",
                      &fStack_688,(ulong)uVar12,uVar28,&fStack_770);
            }
          }
        }
        pcStack_780 = (char *)0x1114d5;
        fwrite("    default: break;\n    }\n}\n\n",0x1d,1,(FILE *)__stream->scope);
      }
      pfVar31 = pfVar31->link;
    } while (pfVar31 != (fb_symbol_t *)0x0);
  }
  pfVar31 = *(fb_symbol_t **)(*(long *)&__stream->scope_len + 0x40);
  if (pfVar31 != (fb_symbol_t *)0x0) {
    do {
      if ((pfVar31->kind == 0) && ((pfVar31[8].kind & 3) != 0)) {
        pcStack_780 = (char *)0x111526;
        memset(&fStack_688,0,0xe8);
        pcStack_780 = (char *)0x111537;
        memset(&fStack_770,0,0xe8);
        pcStack_780 = (char *)0x111546;
        __flatcc_fb_scoped_symbol_name((fb_scope_t *)pfVar31[1].link,pfVar31,&fStack_688);
        pcStack_780 = (char *)0x111561;
        fprintf((FILE *)__stream->scope,"static void %s_sort(%s_mutable_table_t t)\n{\n",&fStack_688
                ,&fStack_688);
        pcVar35 = "    if (!t) return;\n";
        pcStack_780 = (char *)0x11157e;
        fwrite("    if (!t) return;\n",0x14,1,(FILE *)__stream->scope);
        if ((pfVar31[8].kind & 1) != 0) {
          for (puVar39 = *(undefined8 **)&pfVar31[1].kind; puVar39 != (undefined8 *)0x0;
              puVar39 = (undefined8 *)*puVar39) {
            if ((*(byte *)(puVar39 + 0xe) & 4) == 0) {
              uVar12 = *(uint *)((undefined8 *)puVar39[1] + 1);
              uVar28 = *(undefined8 *)puVar39[1];
              if (*(short *)(puVar39 + 5) == 0x10) {
                pcVar35 = (char *)((fb_symbol_t *)puVar39[3])[1].link;
                pcStack_780 = (char *)0x111643;
                __flatcc_fb_scoped_symbol_name
                          ((fb_scope_t *)pcVar35,(fb_symbol_t *)puVar39[3],&fStack_770);
                lVar40 = puVar39[3];
                if (*(short *)(lVar40 + 0x10) == 4) {
                  bVar1 = *(byte *)(lVar40 + 0xd0);
                  pcVar33 = "    __%ssort_union_vector_field_elements(%s, %.*s, %s, t);\n";
                }
                else {
                  if (*(short *)(lVar40 + 0x10) != 0) goto LAB_0011168e;
                  bVar1 = *(byte *)(lVar40 + 0xd0);
                  pcVar33 = "    __%ssort_table_vector_field_elements(%s, %.*s, %s, t);\n";
                }
              }
              else {
                if (*(short *)(puVar39 + 5) != 0xf) goto LAB_0011168e;
                pcVar35 = (char *)((fb_symbol_t *)puVar39[3])[1].link;
                pcStack_780 = (char *)0x11160c;
                __flatcc_fb_scoped_symbol_name
                          ((fb_scope_t *)pcVar35,(fb_symbol_t *)puVar39[3],&fStack_770);
                lVar40 = puVar39[3];
                if (*(short *)(lVar40 + 0x10) == 4) {
                  bVar1 = *(byte *)(lVar40 + 0xd0);
                  pcVar33 = "    __%ssort_union_field(%s, %.*s, %s, t);\n";
                }
                else {
                  if (*(short *)(lVar40 + 0x10) != 0) goto LAB_0011168e;
                  bVar1 = *(byte *)(lVar40 + 0xd0);
                  pcVar33 = "    __%ssort_table_field(%s, %.*s, %s, t);\n";
                }
              }
              if ((bVar1 & 3) != 0) {
                pcVar35 = (char *)__stream->scope;
                pfStack_788 = &fStack_770;
                pfStack_790 = (fb_symbol_t *)0x11168a;
                fprintf((FILE *)pcVar35,pcVar33,__stream,&fStack_688,(ulong)uVar12,uVar28);
              }
            }
LAB_0011168e:
          }
        }
        if ((pfVar31[8].kind & 1) != 0) {
          for (puVar39 = *(undefined8 **)&pfVar31[1].kind; puVar39 != (undefined8 *)0x0;
              puVar39 = (undefined8 *)*puVar39) {
            if ((*(byte *)((long)puVar39 + 0x71) & 0x20) != 0) {
              uVar12 = *(uint *)((undefined8 *)puVar39[1] + 1);
              uVar28 = *(undefined8 *)puVar39[1];
              sVar3 = *(short *)(puVar39 + 5);
              if (sVar3 == 0x10) {
                pfVar6 = (fb_symbol_t *)puVar39[3];
                if (pfVar6[2].ident == (fb_token_t *)0x0) {
LAB_001117d6:
                  pcStack_780 = (char *)0x1117db;
                  __flatcc_fb_gen_c_sorter_cold_1();
                  pfStack_7a8 = __stream;
                  puStack_7a0 = puVar39;
                  uStack_798 = uVar28;
                  pfStack_790 = pfVar31;
                  pfStack_788 = &fStack_688;
                  pcStack_780 = (char *)(ulong)uVar12;
                  println((fb_output_t *)pcVar35,"#ifndef %s_JSON_PARSER_H",
                          ((fb_output_t *)pcVar35)->S->basenameup);
                  println((fb_output_t *)pcVar35,"#define %s_JSON_PARSER_H",
                          ((fb_output_t *)pcVar35)->S->basenameup);
                  println((fb_output_t *)pcVar35,"");
                  println((fb_output_t *)pcVar35,
                          "/* Generated by flatcc 0.6.2 FlatBuffers schema compiler for C by dvide.com */"
                         );
                  println((fb_output_t *)pcVar35,"");
                  println((fb_output_t *)pcVar35,"#include \"flatcc/flatcc_json_parser.h\"");
                  __flatcc_fb_gen_c_includes
                            ((fb_output_t *)pcVar35,"_json_parser.h","_JSON_PARSER_H");
                  if (((fb_output_t *)pcVar35)->opts->cgen_pragmas != 0) {
                    fwrite("#include \"flatcc/flatcc_prologue.h\"\n",0x24,1,
                           (FILE *)((fb_output_t *)pcVar35)->fp);
                  }
                  println((fb_output_t *)pcVar35,"");
                  pfVar31 = (((fb_output_t *)pcVar35)->S->root_type).type;
                  memset(auStack_890,0,0xe8);
                  if ((pfVar31 != (fb_symbol_t *)0x0) && (pfVar31->kind < 2)) {
                    println((fb_output_t *)pcVar35,"/*");
                    println((fb_output_t *)pcVar35,
                            " * Parses the default root table or struct of the schema and constructs a FlatBuffer."
                           );
                    println((fb_output_t *)pcVar35," *");
                    println((fb_output_t *)pcVar35,
                            " * Builder `B` must be initialized. `ctx` can be null but will hold");
                    println((fb_output_t *)pcVar35,
                            " * hold detailed error info on return when available.");
                    println((fb_output_t *)pcVar35," * Returns 0 on success, or error code.");
                    println((fb_output_t *)pcVar35,
                            " * `flags` : 0 by default, `flatcc_json_parser_f_skip_unknown` silently"
                           );
                    println((fb_output_t *)pcVar35,
                            " * ignores unknown table and structs fields, and union types.");
                    println((fb_output_t *)pcVar35," */");
                    println((fb_output_t *)pcVar35,
                            "static int %s_parse_json(flatcc_builder_t *B, flatcc_json_parser_t *ctx,"
                            ,((fb_output_t *)pcVar35)->S->basename);
                    ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + 2;
                    println((fb_output_t *)pcVar35,
                            "const char *buf, size_t bufsiz, flatcc_json_parser_flags_t flags);");
                    iVar13 = ((fb_output_t *)pcVar35)->indent;
                    if ((iVar13 == 0) ||
                       (((fb_output_t *)pcVar35)->indent = iVar13 + -1, iVar13 + -1 == 0)) {
                      __assert_fail("out->indent",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                                    ,0x6e9,"int gen_json_parser_prototypes(fb_output_t *)");
                    }
                    ((fb_output_t *)pcVar35)->indent = iVar13 + -2;
                    println((fb_output_t *)pcVar35,"");
                  }
                  pfVar31 = ((fb_output_t *)pcVar35)->S->symbols;
                  if (pfVar31 == (fb_symbol_t *)0x0) goto LAB_00111b89;
                  goto LAB_00111a2f;
                }
                pcVar35 = (char *)pfVar6[1].link;
                pcStack_780 = (char *)0x111788;
                __flatcc_fb_scoped_symbol_name((fb_scope_t *)pcVar35,pfVar6,&fStack_770);
                if (1 < *(ushort *)(puVar39[3] + 0x10)) goto LAB_00111765;
                pcVar35 = (char *)__stream->scope;
                pcVar33 = "    __%ssort_vector_field(%s, %.*s, %s, t)\n";
                pfStack_788 = &fStack_770;
              }
              else {
                if (sVar3 == 10) {
                  pcVar35 = (char *)__stream->scope;
                  pcStack_780 = "string";
                }
                else {
                  if (sVar3 != 8) goto LAB_00111765;
                  if (0xb < *(int *)(puVar39 + 3) - 1U) {
                    pcStack_780 = (char *)0x1117d6;
                    __flatcc_fb_gen_c_sorter_cold_2();
                    goto LAB_001117d6;
                  }
                  pcStack_780 = &DAT_00141888 +
                                *(int *)(&DAT_00141888 + (ulong)(*(int *)(puVar39 + 3) - 1U) * 4);
                  pcVar35 = (char *)__stream->scope;
                }
                pcVar33 = "    __%ssort_vector_field(%s, %.*s, %s%s, t)\n";
                pfStack_788 = __stream;
              }
              pfStack_790 = (fb_symbol_t *)0x111761;
              fprintf((FILE *)pcVar35,pcVar33,__stream,&fStack_688,(ulong)uVar12,uVar28);
            }
LAB_00111765:
          }
        }
        pcStack_780 = (char *)0x1115b3;
        fwrite("}\n\n",3,1,(FILE *)__stream->scope);
      }
      pfVar31 = pfVar31->link;
    } while (pfVar31 != (fb_symbol_t *)0x0);
  }
  return 0;
LAB_00111a2f:
  do {
    switch(pfVar31->kind) {
    case 0:
      __flatcc_fb_scoped_symbol_name
                ((fb_scope_t *)pfVar31[1].link,pfVar31,(fb_scoped_name_t *)auStack_890);
      pcVar33 = 
      "static const char *%s_parse_json_table(flatcc_json_parser_t *ctx, const char *buf, const char *end, flatcc_builder_ref_t *result);"
      ;
      break;
    case 1:
      __flatcc_fb_scoped_symbol_name
                ((fb_scope_t *)pfVar31[1].link,pfVar31,(fb_scoped_name_t *)auStack_890);
      println((fb_output_t *)pcVar35,
              "static const char *%s_parse_json_struct_inline(flatcc_json_parser_t *ctx, const char *buf, const char *end, void *struct_base);"
              ,(fb_scoped_name_t *)auStack_890);
      pcVar33 = 
      "static const char *%s_parse_json_struct(flatcc_json_parser_t *ctx, const char *buf, const char *end, flatcc_builder_ref_t *result);"
      ;
      break;
    default:
      goto switchD_00111a46_caseD_2;
    case 3:
      __flatcc_fb_scoped_symbol_name
                ((fb_scope_t *)pfVar31[1].link,pfVar31,(fb_scoped_name_t *)auStack_890);
      println((fb_output_t *)pcVar35,
              "static const char *%s_parse_json_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,"
              ,(fb_scoped_name_t *)auStack_890);
      ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + 2;
      println((fb_output_t *)pcVar35,"int *value_type, uint64_t *value, int *aggregate);",
              (fb_scoped_name_t *)auStack_890);
      iVar13 = ((fb_output_t *)pcVar35)->indent;
      if ((iVar13 == 0) || (((fb_output_t *)pcVar35)->indent = iVar13 + -1, iVar13 + -1 == 0)) {
LAB_001132ec:
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x709,"int gen_json_parser_prototypes(fb_output_t *)");
      }
      goto LAB_00111b74;
    case 4:
      __flatcc_fb_scoped_symbol_name
                ((fb_scope_t *)pfVar31[1].link,pfVar31,(fb_scoped_name_t *)auStack_890);
      println((fb_output_t *)pcVar35,
              "static const char *%s_parse_json_union(flatcc_json_parser_t *ctx, const char *buf, const char *end, uint8_t type, flatcc_builder_ref_t *pref);"
              ,(fb_scoped_name_t *)auStack_890);
      println((fb_output_t *)pcVar35,"static int %s_json_union_accept_type(uint8_t type);",
              (fb_scoped_name_t *)auStack_890);
      println((fb_output_t *)pcVar35,
              "static const char *%s_parse_json_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,"
              ,(fb_scoped_name_t *)auStack_890);
      ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + 2;
      println((fb_output_t *)pcVar35,"int *value_type, uint64_t *value, int *aggregate);");
      iVar13 = ((fb_output_t *)pcVar35)->indent;
      if ((iVar13 == 0) || (((fb_output_t *)pcVar35)->indent = iVar13 + -1, iVar13 + -1 == 0)) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x6f9,"int gen_json_parser_prototypes(fb_output_t *)");
      }
LAB_00111b74:
      ((fb_output_t *)pcVar35)->indent = iVar13 + -2;
      goto switchD_00111a46_caseD_2;
    }
    println((fb_output_t *)pcVar35,pcVar33,(fb_scoped_name_t *)auStack_890);
switchD_00111a46_caseD_2:
    pfVar31 = pfVar31->link;
  } while (pfVar31 != (fb_symbol_t *)0x0);
LAB_00111b89:
  fb_scope_table_visit
            (&((fb_output_t *)pcVar35)->S->root_schema->scope_index,gen_local_scope_prototype,
             pcVar35);
  println((fb_output_t *)pcVar35,
          "static const char *%s_global_json_parser_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,"
          ,((fb_output_t *)pcVar35)->S->basename);
  ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + 2;
  println((fb_output_t *)pcVar35,"int *value_type, uint64_t *value, int *aggregate);");
  iVar13 = ((fb_output_t *)pcVar35)->indent;
  if ((iVar13 == 0) || (((fb_output_t *)pcVar35)->indent = iVar13 + -1, iVar13 + -1 == 0)) {
    __assert_fail("out->indent",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                  ,0x711,"int gen_json_parser_prototypes(fb_output_t *)");
  }
  ((fb_output_t *)pcVar35)->indent = iVar13 + -2;
  println((fb_output_t *)pcVar35,"");
  for (ct_00 = (fb_compound_type_t *)((fb_output_t *)pcVar35)->S->symbols;
      ct_00 != (fb_compound_type_t *)0x0; ct_00 = (fb_compound_type_t *)(ct_00->symbol).link) {
    switch((ct_00->symbol).kind) {
    case 0:
      uStack_960 = 0;
      uStack_958._0_4_ = 0;
      uStack_958._4_4_ = 0;
      pgStack_970 = (gen_unmatched_f *)0x0;
      pfStack_968 = (fb_compound_type_t *)0x0;
      auStack_980 = (undefined1  [8])0x0;
      pgStack_978 = (gen_match_f *)0x0;
      if ((ct_00->symbol).kind != 0) {
LAB_0011334e:
        __assert_fail("ct->symbol.kind == fb_is_table",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x5a3,"int gen_table_parser(fb_output_t *, fb_compound_type_t *)");
      }
      auStack_980 = (undefined1  [8])build_compound_dict(ct_00,(int *)&uStack_998);
      uVar12 = uStack_998;
      if (0 < (int)uStack_998 && auStack_980 == (undefined1  [8])0x0) {
        __flatcc_fb_gen_c_json_parser_cold_1();
        goto LAB_001133cf;
      }
      uVar17 = (ulong)uStack_998;
      pgStack_978 = gen_field_match;
      pgStack_970 = gen_field_unmatched;
      if ((int)uStack_998 < 1) {
        uVar22 = 0;
      }
      else {
        lVar40 = 0;
        uVar22 = 0;
        do {
          uVar22 = (uVar22 + 1) -
                   (uint)(*(int *)((long)&((dict_entry_t *)auStack_980)->hint + lVar40) == 0);
          lVar40 = lVar40 + 0x20;
        } while (uVar17 << 5 != lVar40);
      }
      uStack_960 = (ulong)uVar22 << 0x20;
      pfStack_968 = ct_00;
      memset((fb_scoped_name_t *)auStack_890,0,0xe8);
      __flatcc_fb_scoped_symbol_name(ct_00->scope,&ct_00->symbol,(fb_scoped_name_t *)auStack_890);
      println((fb_output_t *)pcVar35,
              "static const char *%s_parse_json_table(flatcc_json_parser_t *ctx, const char *buf, const char *end, flatcc_builder_ref_t *result)"
              ,(fb_scoped_name_t *)auStack_890);
      println((fb_output_t *)pcVar35,"{");
      ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + 1;
      println((fb_output_t *)pcVar35,"int more;");
      if (0 < (int)uVar12) {
        println((fb_output_t *)pcVar35,"void *pval;");
        println((fb_output_t *)pcVar35,"flatcc_builder_ref_t ref, *pref;");
        println((fb_output_t *)pcVar35,"const char *mark;");
        println((fb_output_t *)pcVar35,"uint64_t w;");
      }
      if (uStack_960._4_4_ != 0) {
        println((fb_output_t *)pcVar35,"size_t h_unions;");
      }
      println((fb_output_t *)pcVar35,"");
      println((fb_output_t *)pcVar35,"*result = 0;");
      println((fb_output_t *)pcVar35,"if (flatcc_builder_start_table(ctx->ctx, %lu)) goto failed;",
              ct_00->count);
      if (uStack_960._4_4_ != 0) {
        println((fb_output_t *)pcVar35,
                "if (end == flatcc_json_parser_prepare_unions(ctx, buf, end, %lu, &h_unions)) goto failed;"
               );
      }
      println((fb_output_t *)pcVar35,"buf = flatcc_json_parser_object_start(ctx, buf, end, &more);")
      ;
      println((fb_output_t *)pcVar35,"while (more) {");
      ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + 1;
      println((fb_output_t *)pcVar35,"buf = flatcc_json_parser_symbol_start(ctx, buf, end);");
      if ((int)uVar12 < 1) {
        println((fb_output_t *)pcVar35,"/* Table has no fields. */");
        println((fb_output_t *)pcVar35,"buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);");
      }
      else {
        println((fb_output_t *)pcVar35,"w = flatcc_json_parser_symbol_part(buf, end);");
        gen_trie((fb_output_t *)pcVar35,(trie_t *)auStack_980,0,uVar12 - 1,0);
      }
      println((fb_output_t *)pcVar35,"buf = flatcc_json_parser_object_end(ctx, buf, end, &more);");
      if (((fb_output_t *)pcVar35)->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x5d3,"int gen_table_parser(fb_output_t *, fb_compound_type_t *)");
      }
      ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + -1;
      println((fb_output_t *)pcVar35,"}");
      println((fb_output_t *)pcVar35,"if (ctx->error) goto failed;");
      if (0 < (int)uVar12) {
        bVar43 = true;
        lVar40 = 0;
        do {
          lVar7 = *(long *)((long)((long)auStack_980 + 0x10) + lVar40);
          if ((*(ushort *)(lVar7 + 0x70) & 4) == 0) {
            if ((ushort)((short)*(undefined4 *)(lVar7 + 0x28) - 0xfU) < 2) {
              lVar30 = -(ulong)(*(short *)(*(long *)(lVar7 + 0x18) + 0x10) == 4);
            }
            else {
              lVar30 = 0;
            }
            if ((*(ushort *)(lVar7 + 0x70) >> 8 & 1) != 0) {
              lVar30 = lVar30 + *(long *)(lVar7 + 0x88);
              if (bVar43) {
                bVar43 = false;
                println((fb_output_t *)pcVar35,
                        "if (!flatcc_builder_check_required_field(ctx->ctx, %lu)",lVar30);
                ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + 1;
              }
              else {
                bVar43 = false;
                println((fb_output_t *)pcVar35,
                        "||  !flatcc_builder_check_required_field(ctx->ctx, %lu)",lVar30);
              }
            }
          }
          lVar40 = lVar40 + 0x20;
        } while (uVar17 << 5 != lVar40);
        if (!bVar43) {
          if (((fb_output_t *)pcVar35)->indent == 0) {
            __assert_fail("out->indent",
                          "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                          ,0x5e7,"int gen_table_parser(fb_output_t *, fb_compound_type_t *)");
          }
          ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + -1;
          println((fb_output_t *)pcVar35,") {");
          ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + 1;
          println((fb_output_t *)pcVar35,
                  "buf = flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_required);"
                 );
          println((fb_output_t *)pcVar35,"goto failed;");
          if (((fb_output_t *)pcVar35)->indent == 0) {
            __assert_fail("out->indent",
                          "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                          ,0x5ea,"int gen_table_parser(fb_output_t *, fb_compound_type_t *)");
          }
          ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + -1;
          println((fb_output_t *)pcVar35,"}");
        }
      }
      if (uStack_960._4_4_ != 0) {
        println((fb_output_t *)pcVar35,
                "buf = flatcc_json_parser_finalize_unions(ctx, buf, end, h_unions);");
      }
      println((fb_output_t *)pcVar35,
              "if (!(*result = flatcc_builder_end_table(ctx->ctx))) goto failed;");
      println((fb_output_t *)pcVar35,"return buf;");
      ((fb_output_t *)pcVar35)->tmp_indent = ((fb_output_t *)pcVar35)->indent;
      ((fb_output_t *)pcVar35)->indent = 0;
      println((fb_output_t *)pcVar35,"failed:");
      ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->tmp_indent;
      println((fb_output_t *)pcVar35,
              "return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);"
             );
      if (((fb_output_t *)pcVar35)->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x5f6,"int gen_table_parser(fb_output_t *, fb_compound_type_t *)");
      }
      ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + -1;
      println((fb_output_t *)pcVar35,"}");
      println((fb_output_t *)pcVar35,"");
      println((fb_output_t *)pcVar35,
              "static inline int %s_parse_json_as_root(flatcc_builder_t *B, flatcc_json_parser_t *ctx, const char *buf, size_t bufsiz, flatcc_json_parser_flags_t flags, const char *fid)"
              ,auStack_890);
      println((fb_output_t *)pcVar35,"{");
      ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + 1;
      println((fb_output_t *)pcVar35,
              "return flatcc_json_parser_table_as_root(B, ctx, buf, bufsiz, flags, fid, %s_parse_json_table);"
              ,auStack_890);
      if (((fb_output_t *)pcVar35)->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x5fc,"int gen_table_parser(fb_output_t *, fb_compound_type_t *)");
      }
      ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + -1;
      println((fb_output_t *)pcVar35,"}");
      println((fb_output_t *)pcVar35,"");
      if (auStack_980 != (undefined1  [8])0x0) {
        free((void *)auStack_980);
      }
      break;
    case 1:
      uStack_960 = 0;
      uStack_958._0_4_ = 0;
      uStack_958._4_4_ = 0;
      pgStack_970 = (gen_unmatched_f *)0x0;
      pfStack_968 = (fb_compound_type_t *)0x0;
      auStack_980 = (undefined1  [8])0x0;
      pgStack_978 = (gen_match_f *)0x0;
      if ((ct_00->symbol).kind != 1) {
        __assert_fail("ct->symbol.kind == fb_is_struct",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x54a,"int gen_struct_parser_inline(fb_output_t *, fb_compound_type_t *)");
      }
      auStack_980 = (undefined1  [8])build_compound_dict(ct_00,(int *)&uStack_998);
      uVar12 = uStack_998;
      if (0 < (int)uStack_998 && auStack_980 == (undefined1  [8])0x0) {
        __flatcc_fb_gen_c_json_parser_cold_2();
        goto LAB_0011334e;
      }
      uStack_960 = CONCAT44(uStack_960._4_4_,1);
      pgStack_978 = gen_field_match;
      pgStack_970 = gen_field_unmatched;
      pfStack_968 = ct_00;
      memset((fb_scoped_name_t *)auStack_890,0,0xe8);
      __flatcc_fb_scoped_symbol_name(ct_00->scope,&ct_00->symbol,(fb_scoped_name_t *)auStack_890);
      println((fb_output_t *)pcVar35,
              "static const char *%s_parse_json_struct_inline(flatcc_json_parser_t *ctx, const char *buf, const char *end, void *struct_base)"
              ,(fb_scoped_name_t *)auStack_890);
      println((fb_output_t *)pcVar35,"{");
      ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + 1;
      println((fb_output_t *)pcVar35,"int more;");
      if (0 < (int)uVar12) {
        println((fb_output_t *)pcVar35,"flatcc_builder_ref_t ref;");
        println((fb_output_t *)pcVar35,"void *pval;");
        println((fb_output_t *)pcVar35,"const char *mark;");
        println((fb_output_t *)pcVar35,"uint64_t w;");
      }
      println((fb_output_t *)pcVar35,"");
      println((fb_output_t *)pcVar35,"buf = flatcc_json_parser_object_start(ctx, buf, end, &more);")
      ;
      println((fb_output_t *)pcVar35,"while (more) {");
      ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + 1;
      if (uVar12 == 0) {
        println((fb_output_t *)pcVar35,"/* Empty struct. */");
        println((fb_output_t *)pcVar35,"buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);");
      }
      else {
        println((fb_output_t *)pcVar35,"buf = flatcc_json_parser_symbol_start(ctx, buf, end);");
        println((fb_output_t *)pcVar35,"w = flatcc_json_parser_symbol_part(buf, end);");
        gen_trie((fb_output_t *)pcVar35,(trie_t *)auStack_980,0,uVar12 - 1,0);
      }
      println((fb_output_t *)pcVar35,"buf = flatcc_json_parser_object_end(ctx, buf, end , &more);");
      if (((fb_output_t *)pcVar35)->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x56b,"int gen_struct_parser_inline(fb_output_t *, fb_compound_type_t *)");
      }
      ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + -1;
      println((fb_output_t *)pcVar35,"}");
      println((fb_output_t *)pcVar35,"return buf;");
      if (0 < (int)uVar12) {
        ((fb_output_t *)pcVar35)->tmp_indent = ((fb_output_t *)pcVar35)->indent;
        ((fb_output_t *)pcVar35)->indent = 0;
        println((fb_output_t *)pcVar35,"failed:");
        ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->tmp_indent;
        println((fb_output_t *)pcVar35,
                "return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);"
               );
      }
      if (((fb_output_t *)pcVar35)->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x574,"int gen_struct_parser_inline(fb_output_t *, fb_compound_type_t *)");
      }
      ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + -1;
      println((fb_output_t *)pcVar35,"}");
      println((fb_output_t *)pcVar35,"");
      if (auStack_980 != (undefined1  [8])0x0) {
        free((void *)auStack_980);
      }
      if ((ct_00->symbol).kind != 1) {
        __assert_fail("ct->symbol.kind == fb_is_struct",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x57e,"int gen_struct_parser(fb_output_t *, fb_compound_type_t *)");
      }
      memset((fb_scoped_name_t *)auStack_890,0,0xe8);
      __flatcc_fb_scoped_symbol_name(ct_00->scope,&ct_00->symbol,(fb_scoped_name_t *)auStack_890);
      println((fb_output_t *)pcVar35,
              "static const char *%s_parse_json_struct(flatcc_json_parser_t *ctx, const char *buf, const char *end, flatcc_builder_ref_t *result)"
              ,(fb_scoped_name_t *)auStack_890);
      println((fb_output_t *)pcVar35,"{");
      ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + 1;
      println((fb_output_t *)pcVar35,"void *pval;");
      println((fb_output_t *)pcVar35,"");
      println((fb_output_t *)pcVar35,"*result = 0;");
      println((fb_output_t *)pcVar35,
              "if (!(pval = flatcc_builder_start_struct(ctx->ctx, %lu, %u))) goto failed;",
              ct_00->size,(ulong)ct_00->align);
      println((fb_output_t *)pcVar35,"buf = %s_parse_json_struct_inline(ctx, buf, end, pval);",
              (fb_scoped_name_t *)auStack_890);
      println((fb_output_t *)pcVar35,
              "if (ctx->error || !(*result = flatcc_builder_end_struct(ctx->ctx))) goto failed;");
      println((fb_output_t *)pcVar35,"return buf;");
      ((fb_output_t *)pcVar35)->tmp_indent = ((fb_output_t *)pcVar35)->indent;
      ((fb_output_t *)pcVar35)->indent = 0;
      println((fb_output_t *)pcVar35,"failed:");
      ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->tmp_indent;
      println((fb_output_t *)pcVar35,
              "return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);"
             );
      if (((fb_output_t *)pcVar35)->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x58f,"int gen_struct_parser(fb_output_t *, fb_compound_type_t *)");
      }
      ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + -1;
      println((fb_output_t *)pcVar35,"}");
      println((fb_output_t *)pcVar35,"");
      println((fb_output_t *)pcVar35,
              "static inline int %s_parse_json_as_root(flatcc_builder_t *B, flatcc_json_parser_t *ctx, const char *buf, size_t bufsiz, flatcc_json_parser_flags_t flags, const char *fid)"
              ,(fb_scoped_name_t *)auStack_890);
      println((fb_output_t *)pcVar35,"{");
      ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + 1;
      println((fb_output_t *)pcVar35,
              "return flatcc_json_parser_struct_as_root(B, ctx, buf, bufsiz, flags, fid, %s_parse_json_struct);"
              ,(fb_scoped_name_t *)auStack_890);
      if (((fb_output_t *)pcVar35)->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x595,"int gen_struct_parser(fb_output_t *, fb_compound_type_t *)");
      }
      ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + -1;
      println((fb_output_t *)pcVar35,"}");
      println((fb_output_t *)pcVar35,"");
      break;
    case 3:
      gen_enum_parser((fb_output_t *)pcVar35,ct_00);
      break;
    case 4:
      memset((fb_scoped_name_t *)auStack_890,0,0xe8);
      memset(auStack_980,0,0xe8);
      __flatcc_fb_scoped_symbol_name(ct_00->scope,&ct_00->symbol,(fb_scoped_name_t *)auStack_890);
      println((fb_output_t *)pcVar35,
              "static const char *%s_parse_json_union(flatcc_json_parser_t *ctx, const char *buf, const char *end, uint8_t type, flatcc_builder_ref_t *result)"
              ,(fb_scoped_name_t *)auStack_890);
      println((fb_output_t *)pcVar35,"{");
      ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + 1;
      println((fb_output_t *)pcVar35,"");
      println((fb_output_t *)pcVar35,"*result = 0;");
      println((fb_output_t *)pcVar35,"switch (type) {");
      println((fb_output_t *)pcVar35,"case 0: /* NONE */");
      ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + 1;
      println((fb_output_t *)pcVar35,"return flatcc_json_parser_none(ctx, buf, end);");
      if (((fb_output_t *)pcVar35)->indent == 0) {
LAB_001133cf:
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x614,"int gen_union_parser(fb_output_t *, fb_compound_type_t *)");
      }
      ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + -1;
      for (pfVar31 = ct_00->members; pfVar31 != (fb_symbol_t *)0x0; pfVar31 = pfVar31->link) {
        uVar4 = pfVar31[1].kind;
        if (uVar4 != 0) {
          uVar12 = (uint)pfVar31->ident->len;
          if (uVar4 == 0xb) {
            println((fb_output_t *)pcVar35,"case %u: /* %.*s */",(ulong)*(uint *)&pfVar31[3].link,
                    (ulong)uVar12);
            ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + 1;
            println((fb_output_t *)pcVar35,
                    "buf = flatcc_json_parser_build_string(ctx, buf, end, result);");
            println((fb_output_t *)pcVar35,"break;");
            iVar13 = ((fb_output_t *)pcVar35)->indent;
            if (iVar13 == 0) {
              __assert_fail("out->indent",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                            ,0x631,"int gen_union_parser(fb_output_t *, fb_compound_type_t *)");
            }
          }
          else {
            if (uVar4 != 0xf) {
              __flatcc_fb_gen_c_json_parser_cold_4();
LAB_001132a9:
              __assert_fail("out->indent",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                            ,0x62b,"int gen_union_parser(fb_output_t *, fb_compound_type_t *)");
            }
            __flatcc_fb_scoped_symbol_name
                      ((fb_scope_t *)pfVar31[1].link[1].link,pfVar31[1].link,
                       (fb_scoped_name_t *)auStack_980);
            println((fb_output_t *)pcVar35,"case %u: /* %.*s */",(ulong)*(uint *)&pfVar31[3].link,
                    (ulong)uVar12);
            ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + 1;
            uVar4 = (pfVar31[1].link)->kind;
            pcVar33 = "buf = %s_parse_json_table(ctx, buf, end, result);";
            if (uVar4 != 0) {
              if (uVar4 != 1) {
                __flatcc_fb_gen_c_json_parser_cold_3();
                goto LAB_001132ec;
              }
              pcVar33 = "buf = %s_parse_json_struct(ctx, buf, end, result);";
            }
            println((fb_output_t *)pcVar35,pcVar33,auStack_980);
            println((fb_output_t *)pcVar35,"break;");
            iVar13 = ((fb_output_t *)pcVar35)->indent;
            if (iVar13 == 0) goto LAB_001132a9;
          }
          ((fb_output_t *)pcVar35)->indent = iVar13 + -1;
        }
      }
      println((fb_output_t *)pcVar35,"default:");
      ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + 1;
      println((fb_output_t *)pcVar35,"if (!(ctx->flags & flatcc_json_parser_f_skip_unknown)) {");
      ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + 1;
      println((fb_output_t *)pcVar35,
              "return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_unknown_union);"
             );
      if (((fb_output_t *)pcVar35)->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x63c,"int gen_union_parser(fb_output_t *, fb_compound_type_t *)");
      }
      ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + -1;
      println((fb_output_t *)pcVar35,"} else {");
      ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + 1;
      println((fb_output_t *)pcVar35,"return flatcc_json_parser_generic_json(ctx, buf, end);");
      if (((fb_output_t *)pcVar35)->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x63e,"int gen_union_parser(fb_output_t *, fb_compound_type_t *)");
      }
      ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + -1;
      println((fb_output_t *)pcVar35,"}");
      if (((fb_output_t *)pcVar35)->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x63f,"int gen_union_parser(fb_output_t *, fb_compound_type_t *)");
      }
      ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + -1;
      println((fb_output_t *)pcVar35,"}");
      println((fb_output_t *)pcVar35,"if (ctx->error) return buf;");
      println((fb_output_t *)pcVar35,"if (!*result) {");
      ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + 1;
      println((fb_output_t *)pcVar35,
              "return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);"
             );
      if (((fb_output_t *)pcVar35)->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x643,"int gen_union_parser(fb_output_t *, fb_compound_type_t *)");
      }
      ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + -1;
      println((fb_output_t *)pcVar35,"}");
      println((fb_output_t *)pcVar35,"return buf;");
      if (((fb_output_t *)pcVar35)->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x645,"int gen_union_parser(fb_output_t *, fb_compound_type_t *)");
      }
      ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + -1;
      println((fb_output_t *)pcVar35,"}");
      println((fb_output_t *)pcVar35,"");
      memset((fb_scoped_name_t *)auStack_890,0,0xe8);
      __flatcc_fb_scoped_symbol_name(ct_00->scope,&ct_00->symbol,(fb_scoped_name_t *)auStack_890);
      println((fb_output_t *)pcVar35,"static int %s_json_union_accept_type(uint8_t type)",
              (fb_scoped_name_t *)auStack_890);
      println((fb_output_t *)pcVar35,"{");
      ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + 1;
      println((fb_output_t *)pcVar35,"switch (type) {");
      for (pfVar31 = ct_00->members; pfVar31 != (fb_symbol_t *)0x0; pfVar31 = pfVar31->link) {
        if (pfVar31[1].kind == 0) {
          println((fb_output_t *)pcVar35,"case 0: return 1; /* NONE */");
        }
        else {
          println((fb_output_t *)pcVar35,"case %u: return 1; /* %.*s */",
                  (ulong)*(uint *)&pfVar31[3].link,(ulong)(uint)pfVar31->ident->len);
        }
      }
      println((fb_output_t *)pcVar35,"default: return 0;");
      iVar13 = ((fb_output_t *)pcVar35)->indent;
      iVar11 = iVar13 + 1;
      ((fb_output_t *)pcVar35)->indent = iVar11;
      if (iVar11 == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x663,"int gen_union_accept_type(fb_output_t *, fb_compound_type_t *)");
      }
      ((fb_output_t *)pcVar35)->indent = iVar13;
      println((fb_output_t *)pcVar35,"}");
      if (((fb_output_t *)pcVar35)->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x664,"int gen_union_accept_type(fb_output_t *, fb_compound_type_t *)");
      }
      ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + -1;
      println((fb_output_t *)pcVar35,"}");
      println((fb_output_t *)pcVar35,"");
      gen_enum_parser((fb_output_t *)pcVar35,ct_00);
    }
  }
  fb_scope_table_visit
            (&((fb_output_t *)pcVar35)->S->root_schema->scope_index,gen_local_scope_parser,pcVar35);
  auStack_980 = (undefined1  [8])0x0;
  pgStack_978 = (gen_match_f *)0x0;
  pgStack_970 = (gen_unmatched_f *)0x0;
  pfStack_968 = (fb_compound_type_t *)0x0;
  uStack_960._0_4_ = 0;
  uStack_960._4_4_ = 0;
  uStack_958._0_4_ = 0;
  uStack_958._4_4_ = 0;
  pfStack_838 = ((fb_output_t *)pcVar35)->S;
  pfStack_990 = pfStack_838->root_schema;
  auStack_890._8_4_ = 0;
  auStack_890._12_4_ = 0;
  pcStack_840 = (char *)0x0;
  peStack_850 = (enum_entry_t *)0x0;
  psStack_848 = (service_entry_t *)0x0;
  pcStack_860 = (char *)0x0;
  poStack_858 = (object_entry_t *)0x0;
  peStack_870 = (enum_entry_t *)0x0;
  psStack_868 = (service_entry_t *)0x0;
  auStack_890._16_8_ = 0;
  poStack_878 = (object_entry_t *)0x0;
  auStack_890._0_4_ = 1;
  auStack_890._4_4_ = 0;
  fb_scope_table_visit(&pfStack_990->scope_index,count_symbols,auStack_890);
  sVar15 = (size_t)(int)auStack_890._4_4_;
  peVar18 = (entry_t *)calloc(sVar15,0x10);
  uVar44 = auStack_890._8_4_;
  poStack_878 = peVar18;
  peVar19 = (entry_t *)calloc((long)(int)auStack_890._8_4_,0x10);
  iStack_994 = auStack_890._12_4_;
  peStack_870 = peVar19;
  peVar20 = (entry_t *)calloc((long)(int)auStack_890._12_4_,0x10);
  sStack_988 = auStack_890._16_8_;
  psStack_868 = peVar20;
  pcStack_860 = (char *)malloc(auStack_890._16_8_);
  poStack_858 = peVar18;
  peStack_850 = peVar19;
  psStack_848 = peVar20;
  pcStack_840 = pcStack_860;
  if (((((long)sVar15 < 1 || peVar18 != (entry_t *)0x0) &&
       ((int)uVar44 < 1 || peVar19 != (entry_t *)0x0)) &&
      (iStack_994 < 1 || peVar20 != (entry_t *)0x0)) &&
     (sStack_988 == 0 || pcStack_860 != (char *)0x0)) {
    fb_scope_table_visit(&pfStack_990->scope_index,install_symbols,auStack_890);
    sort_entries(poStack_878,auStack_890._4_4_);
    sort_entries(peStack_870,auStack_890._8_4_);
    sort_entries(psStack_868,auStack_890._12_4_);
    iVar13 = auStack_890._8_4_;
    sVar15 = (size_t)(int)auStack_890._8_4_;
    if ((sVar15 == 0) ||
       (__base = (dict_entry_t *)malloc(sVar15 << 5), peVar10 = peStack_870,
       __base == (dict_entry_t *)0x0)) {
      __base = (dict_entry_t *)0x0;
    }
    else {
      lVar40 = 8;
      sVar32 = sVar15;
      do {
        pcVar33 = *(char **)((long)&peVar10->ct + lVar40);
        *(char **)((long)__base + lVar40 * 2 + -0x10) = pcVar33;
        sVar21 = strlen(pcVar33);
        *(int *)((long)__base + lVar40 * 2 + -8) = (int)sVar21;
        *(undefined8 *)((long)&__base->text + lVar40 * 2) =
             *(undefined8 *)((long)peVar10 + lVar40 + -8);
        *(undefined4 *)((long)&__base->len + lVar40 * 2) = 0;
        lVar40 = lVar40 + 0x10;
        sVar32 = sVar32 - 1;
      } while (sVar32 != 0);
      qsort(__base,sVar15,0x20,dict_cmp);
      iVar13 = auStack_890._8_4_;
    }
    auStack_980 = (undefined1  [8])__base;
    if (0 < iVar13 && __base == (dict_entry_t *)0x0) {
      __flatcc_fb_gen_c_json_parser_cold_5();
LAB_001136a5:
      __assert_fail("out->indent",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                    ,0x4ef,"int gen_global_scope_parser(fb_output_t *)");
    }
    pfStack_968 = (fb_compound_type_t *)0x0;
    uStack_960._0_4_ = 4;
    pgStack_978 = gen_scope_match;
    pgStack_970 = gen_scope_unmatched;
    println((fb_output_t *)pcVar35,
            "static const char *%s_global_json_parser_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,"
            ,((fb_output_t *)pcVar35)->S->basename);
    ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + 2;
    println((fb_output_t *)pcVar35,"int *value_type, uint64_t *value, int *aggregate)");
    iVar11 = ((fb_output_t *)pcVar35)->indent;
    if ((iVar11 == 0) || (((fb_output_t *)pcVar35)->indent = iVar11 + -1, iVar11 + -1 == 0)) {
      __assert_fail("out->indent",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                    ,0x4ea,"int gen_global_scope_parser(fb_output_t *)");
    }
    ((fb_output_t *)pcVar35)->indent = iVar11 + -2;
    println((fb_output_t *)pcVar35,"{");
    ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + 1;
    if (iVar13 == 0) {
      println((fb_output_t *)pcVar35,"/* Global scope has no enum / union types to look up. */");
      println((fb_output_t *)pcVar35,"return buf; /* unmatched; */");
      iVar13 = ((fb_output_t *)pcVar35)->indent;
      if (iVar13 == 0) goto LAB_001136a5;
    }
    else {
      println((fb_output_t *)pcVar35,"const char *unmatched = buf;");
      println((fb_output_t *)pcVar35,"const char *mark;");
      println((fb_output_t *)pcVar35,"uint64_t w;");
      println((fb_output_t *)pcVar35,"");
      println((fb_output_t *)pcVar35,"w = flatcc_json_parser_symbol_part(buf, end);");
      gen_trie((fb_output_t *)pcVar35,(trie_t *)auStack_980,0,iVar13 + -1,0);
      println((fb_output_t *)pcVar35,"return buf;");
      iVar13 = ((fb_output_t *)pcVar35)->indent;
      if (iVar13 == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x4f8,"int gen_global_scope_parser(fb_output_t *)");
      }
    }
    ((fb_output_t *)pcVar35)->indent = iVar13 + -1;
    println((fb_output_t *)pcVar35,"}");
    println((fb_output_t *)pcVar35,"");
    if (auStack_980 != (undefined1  [8])0x0) {
      free((void *)auStack_980);
    }
  }
  clear_catalog((catalog_t *)auStack_890);
  pfVar31 = (((fb_output_t *)pcVar35)->S->root_type).type;
  if (pfVar31 != (fb_symbol_t *)0x0) {
    if (pfVar31->kind == 1) {
      memset((fb_scoped_name_t *)auStack_890,0,0xe8);
      __flatcc_fb_scoped_symbol_name
                ((fb_scope_t *)pfVar31[1].link,pfVar31,(fb_scoped_name_t *)auStack_890);
      println((fb_output_t *)pcVar35,
              "static int %s_parse_json(flatcc_builder_t *B, flatcc_json_parser_t *ctx,",
              ((fb_output_t *)pcVar35)->S->basename);
      ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + 2;
      println((fb_output_t *)pcVar35,"const char *buf, size_t bufsiz, int flags)");
      iVar13 = ((fb_output_t *)pcVar35)->indent;
      if ((iVar13 == 0) || (((fb_output_t *)pcVar35)->indent = iVar13 + -1, iVar13 + -1 == 0)) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x6a2,"int gen_root_struct_parser(fb_output_t *, fb_compound_type_t *)");
      }
      ((fb_output_t *)pcVar35)->indent = iVar13 + -2;
      println((fb_output_t *)pcVar35,"{");
      ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + 1;
      println((fb_output_t *)pcVar35,"flatcc_json_parser_t ctx_;");
      println((fb_output_t *)pcVar35,"flatcc_builder_ref_t root;");
      println((fb_output_t *)pcVar35,"");
      println((fb_output_t *)pcVar35,"ctx = ctx ? ctx : &ctx_;");
      println((fb_output_t *)pcVar35,"flatcc_json_parser_init(ctx, B, buf, buf + bufsiz, flags);");
      pfVar8 = ((fb_output_t *)pcVar35)->S;
      if ((pfVar8->file_identifier).type == 3) {
        println((fb_output_t *)pcVar35,
                "if (flatcc_builder_start_buffer(B, \"%.*s\", 0, 0)) return -1;",
                (ulong)(uint)(pfVar8->file_identifier).field_0.s.len,
                (pfVar8->file_identifier).field_0.s.s);
      }
      else {
        println((fb_output_t *)pcVar35,"if (flatcc_builder_start_buffer(B, 0, 0, 0)) return -1;");
      }
      println((fb_output_t *)pcVar35,"buf = %s_parse_json_struct(ctx, buf, buf + bufsiz, &root);",
              auStack_890);
      println((fb_output_t *)pcVar35,"if (ctx->error) {");
      ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + 1;
      println((fb_output_t *)pcVar35,"return ctx->error;");
      if (((fb_output_t *)pcVar35)->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x6b2,"int gen_root_struct_parser(fb_output_t *, fb_compound_type_t *)");
      }
      ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + -1;
      println((fb_output_t *)pcVar35,"}");
      println((fb_output_t *)pcVar35,"if (!flatcc_builder_end_buffer(B, root)) return -1;");
      println((fb_output_t *)pcVar35,"ctx->end_loc = buf;");
      println((fb_output_t *)pcVar35,"return 0;");
      iVar13 = ((fb_output_t *)pcVar35)->indent;
      if (iVar13 == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x6b6,"int gen_root_struct_parser(fb_output_t *, fb_compound_type_t *)");
      }
    }
    else {
      if (pfVar31->kind != 0) goto LAB_00113244;
      memset((fb_scoped_name_t *)auStack_890,0,0xe8);
      __flatcc_fb_scoped_symbol_name
                ((fb_scope_t *)pfVar31[1].link,pfVar31,(fb_scoped_name_t *)auStack_890);
      println((fb_output_t *)pcVar35,
              "static int %s_parse_json(flatcc_builder_t *B, flatcc_json_parser_t *ctx,",
              ((fb_output_t *)pcVar35)->S->basename);
      ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + 2;
      println((fb_output_t *)pcVar35,
              "const char *buf, size_t bufsiz, flatcc_json_parser_flags_t flags)");
      iVar13 = ((fb_output_t *)pcVar35)->indent;
      if ((iVar13 == 0) || (((fb_output_t *)pcVar35)->indent = iVar13 + -1, iVar13 + -1 == 0)) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x67f,"int gen_root_table_parser(fb_output_t *, fb_compound_type_t *)");
      }
      ((fb_output_t *)pcVar35)->indent = iVar13 + -2;
      println((fb_output_t *)pcVar35,"{");
      ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + 1;
      println((fb_output_t *)pcVar35,"flatcc_json_parser_t parser;");
      println((fb_output_t *)pcVar35,"flatcc_builder_ref_t root;");
      println((fb_output_t *)pcVar35,"");
      println((fb_output_t *)pcVar35,"ctx = ctx ? ctx : &parser;");
      println((fb_output_t *)pcVar35,"flatcc_json_parser_init(ctx, B, buf, buf + bufsiz, flags);");
      pfVar8 = ((fb_output_t *)pcVar35)->S;
      if ((pfVar8->file_identifier).type == 3) {
        println((fb_output_t *)pcVar35,
                "if (flatcc_builder_start_buffer(B, \"%.*s\", 0, 0)) return -1;",
                (ulong)(uint)(pfVar8->file_identifier).field_0.s.len,
                (pfVar8->file_identifier).field_0.s.s);
      }
      else {
        println((fb_output_t *)pcVar35,"if (flatcc_builder_start_buffer(B, 0, 0, 0)) return -1;");
      }
      println((fb_output_t *)pcVar35,"%s_parse_json_table(ctx, buf, buf + bufsiz, &root);",
              auStack_890);
      println((fb_output_t *)pcVar35,"if (ctx->error) {");
      ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + 1;
      println((fb_output_t *)pcVar35,"return ctx->error;");
      if (((fb_output_t *)pcVar35)->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x68f,"int gen_root_table_parser(fb_output_t *, fb_compound_type_t *)");
      }
      ((fb_output_t *)pcVar35)->indent = ((fb_output_t *)pcVar35)->indent + -1;
      println((fb_output_t *)pcVar35,"}");
      println((fb_output_t *)pcVar35,"if (!flatcc_builder_end_buffer(B, root)) return -1;");
      println((fb_output_t *)pcVar35,"ctx->end_loc = buf;");
      println((fb_output_t *)pcVar35,"return 0;");
      iVar13 = ((fb_output_t *)pcVar35)->indent;
      if (iVar13 == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x693,"int gen_root_table_parser(fb_output_t *, fb_compound_type_t *)");
      }
    }
    ((fb_output_t *)pcVar35)->indent = iVar13 + -1;
    println((fb_output_t *)pcVar35,"}");
    println((fb_output_t *)pcVar35,"");
  }
LAB_00113244:
  if (((fb_output_t *)pcVar35)->opts->cgen_pragmas != 0) {
    fwrite("#include \"flatcc/flatcc_epilogue.h\"\n",0x24,1,(FILE *)((fb_output_t *)pcVar35)->fp);
  }
  println((fb_output_t *)pcVar35,"#endif /* %s_JSON_PARSER_H */",
          ((fb_output_t *)pcVar35)->S->basenameup);
  return 0;
}

Assistant:

static int gen_builder_struct_field_assign(fb_output_t *out, fb_compound_type_t *ct, int index, int arg_count,
        int conversion, int from_ptr)
{
    const char *nsc = out->nsc;
    fb_member_t *member;
    fb_symbol_t *sym;
    int n, len;
    const char *s;
    int deprecated_index = 0;
    const char *kind, *tprefix;
    fb_scoped_name_t snref;

    fb_clear(snref);
    switch (conversion) {
    case convert_to_pe: kind = "_to_pe"; break;
    case convert_from_pe: kind = "_from_pe"; break;
    default: kind = ""; break;
    }
    for (sym = ct->members; sym; sym = sym->link) {
        member = (fb_member_t *)sym;
        symbol_name(sym, &n, &s);

        if (index > 0) {
            if (index % 4 == 0) {
                fprintf(out->fp, ";\n  ");
            } else {
                fprintf(out->fp, "; ");
            }
        }
        switch (member->type.type) {
        case vt_fixed_array_compound_type_ref:
            len = (int)member->type.len;
            fb_compound_name(member->type.ct, &snref);
            if (member->metadata_flags & fb_f_deprecated) {
                fprintf(out->fp, "__%sstruct_clear_field(p->__deprecated%i)",
                        nsc, deprecated_index);
                ++deprecated_index;
                ++index;
                continue;
            }
            if (from_ptr) {
                fprintf(out->fp, "%s_array_copy%s(p->%.*s, p2->%.*s, %d)",
                        snref.text, kind, n, s, n, s, len);
            } else {
                fprintf(out->fp, "%s_array_copy%s(p->%.*s, v%i, %d)",
                        snref.text, kind, n, s, index, len);
            }
            ++index;
            continue;
        case vt_compound_type_ref:
            fb_compound_name(member->type.ct, &snref);
            if (member->type.ct->symbol.kind == fb_is_struct) {
                if (member->metadata_flags & fb_f_deprecated) {
                    fprintf(out->fp, "__%sstruct_clear_field(p->__deprecated%i)",
                            nsc, deprecated_index);
                    deprecated_index++;
                    index += get_total_struct_field_count(member->type.ct);
                    continue;
                }
                if (from_ptr) {
                    fprintf(out->fp, "%s_copy%s(&p->%.*s, &p2->%.*s)", snref.text, kind, n, s, n, s);
                    /* `index` does not count children, but it doesn't matter here. */
                    ++index;
                } else {
                    fprintf(out->fp, "%s_assign%s(&p->%.*s", snref.text, kind, n, s);
                    index = gen_builder_struct_call_list(out, member->type.ct, index, arg_count, 0);
                    fprintf(out->fp, ")");
                }
                continue;
            }
            if (member->metadata_flags & fb_f_deprecated) {
                fprintf(out->fp, "__%sstruct_clear_field(p->__deprecated%i)",
                        nsc, deprecated_index);
                ++deprecated_index;
                ++index;
                continue;
            }
            switch (member->size == 1 ? no_conversion : conversion) {
            case convert_from_pe:
                if (from_ptr) {
                    fprintf(out->fp, "%s_copy_from_pe(&p->%.*s, &p2->%.*s)",
                            snref.text, n, s, n, s);
                } else {
                    fprintf(out->fp, "%s_assign_from_pe(&p->%.*s, v%i)",
                            snref.text, n, s, index);
                }
                break;
            case convert_to_pe:
                if (from_ptr) {
                    fprintf(out->fp, "%s_copy_to_pe(&p->%.*s, &p2->%.*s)",
                            snref.text, n, s, n, s);
                } else {
                    fprintf(out->fp, "%s_assign_to_pe(&p->%.*s, v%i)",
                            snref.text, n, s, index);
                }
                break;
            default:
                if (from_ptr) {
                    fprintf(out->fp, "p->%.*s = p2->%.*s", n, s, n, s);
                } else {
                    fprintf(out->fp, "p->%.*s = v%i", n, s, index);
                }
                break;
            }
            ++index;
            continue;
        case vt_fixed_array_type:
            tprefix = scalar_type_prefix(member->type.st);
            len = (int)member->type.len;
            if (member->metadata_flags & fb_f_deprecated) {
                fprintf(out->fp, "__%sstruct_clear_field(p->__deprecated%i)",
                        nsc, deprecated_index);
                ++deprecated_index;
                ++index;
                continue;
            }
            if (from_ptr) {
                fprintf(out->fp, "%s%s_array_copy%s(p->%.*s, p2->%.*s, %d)",
                        nsc, tprefix, kind, n, s, n, s, len);
            } else {
                fprintf(out->fp, "%s%s_array_copy%s(p->%.*s, v%i, %d)",
                        nsc, tprefix, kind, n, s, index, len);
            }
            ++index;
            break;
        case vt_scalar_type:
            tprefix = scalar_type_prefix(member->type.st);
            if (member->metadata_flags & fb_f_deprecated) {
                fprintf(out->fp, "__%sstruct_clear_field(p->__deprecated%i)",
                        nsc, deprecated_index);
                ++deprecated_index;
                ++index;
                continue;
            }
            switch (member->size == 1 ? no_conversion : conversion) {
            case convert_from_pe:
                if (from_ptr) {
                    fprintf(out->fp, "%s%s_copy_from_pe(&p->%.*s, &p2->%.*s)",
                            nsc, tprefix, n, s, n, s);
                } else {
                    fprintf(out->fp, "%s%s_assign_from_pe(&p->%.*s, v%i)",
                            nsc, tprefix, n, s, index);
                }
                break;
            case convert_to_pe:
                if (from_ptr) {
                    fprintf(out->fp, "%s%s_copy_to_pe(&p->%.*s, &p2->%.*s)",
                            nsc, tprefix, n, s, n, s);
                } else {
                    fprintf(out->fp, "%s%s_assign_to_pe(&p->%.*s, v%i)",
                            nsc, tprefix, n, s, index);
                }
                break;
            default:
                if (from_ptr) {
                    fprintf(out->fp, "p->%.*s = p2->%.*s", n, s, n, s);
                } else {
                    fprintf(out->fp, "p->%.*s = v%i", n, s, index);
                }
                break;
            }
            ++index;
            break;
        default:
            gen_panic(out, "internal error: type error");
            continue;
        }
    }
    if (arg_count > 0) {
        fprintf(out->fp, ";\n  ");
    }
    return index;
}